

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_fma.cpp
# Opt level: O0

void ncnn::softmax_pack1(float *_ptr,int elemcount,int stride,int size1,float *_maxptr,
                        float *_sumptr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [12];
  undefined1 auVar70 [64];
  undefined1 auVar71 [24];
  undefined1 auVar72 [40];
  undefined1 auVar73 [48];
  undefined1 auVar74 [56];
  undefined1 auVar75 [24];
  float *pfVar76;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined1 (*in_R8) [64];
  undefined1 (*in_R9) [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  float fVar81;
  float fVar82;
  undefined1 auVar80 [32];
  __m128 _sum_8;
  __m128 _p_8;
  __m256 _sum_7;
  __m256 _p_7;
  __m512 _sum_6;
  __m512 _p_6;
  int j_3;
  float *sumptr_2;
  float *ptr_2;
  int i_2;
  __m128 _sum_5;
  __m128 _one;
  __m256 _sum_4;
  __m256 _one_avx;
  __m512 _sum_3;
  __m512 _one_avx512;
  int j_2;
  float *sumptr_1;
  float v;
  __m128 _sum_2;
  __m128 _max_5;
  __m128 _p_5;
  __m256 _sum_1;
  __m256 _max_4;
  __m256 _p_4;
  __m512 _sum;
  __m512 _max_3;
  __m512 _p_3;
  int j_1;
  float *sumptr;
  float *maxptr_1;
  float *ptr_1;
  int i_1;
  __m128 _max_2;
  __m128 _p_2;
  __m256 _max_1;
  __m256 _p_1;
  __m512 _max;
  __m512 _p;
  int j;
  float *maxptr;
  float *ptr;
  int i;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  float fStack_2bc4;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  undefined4 uStack_2b84;
  int local_2afc;
  undefined1 (*local_2af8) [64];
  undefined1 (*local_2af0) [64];
  int local_2ae4;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  int local_29e4;
  undefined1 (*local_29e0) [64];
  float fStack_29c4;
  undefined8 local_29b0;
  undefined8 uStack_29a8;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  int local_2844;
  undefined1 (*local_2840) [64];
  undefined1 (*local_2838) [64];
  undefined1 (*local_2830) [64];
  int local_2824;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  int local_2704;
  undefined1 (*local_2700) [64];
  undefined1 (*local_26f8) [64];
  int local_26ec;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined1 local_23c0 [8];
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined1 local_22c0 [16];
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined1 local_1d80 [8];
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined1 local_1d60 [32];
  undefined4 local_1d40;
  undefined4 uStack_1d3c;
  undefined4 uStack_1d38;
  undefined4 uStack_1d34;
  undefined4 uStack_1d30;
  undefined4 uStack_1d2c;
  undefined4 uStack_1d28;
  undefined4 uStack_1d24;
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [8];
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined1 local_1cc0 [32];
  undefined4 local_1ca0;
  undefined4 uStack_1c9c;
  undefined4 uStack_1c98;
  undefined4 uStack_1c94;
  undefined4 uStack_1c90;
  undefined4 uStack_1c8c;
  undefined4 uStack_1c88;
  undefined4 uStack_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined1 (*local_1b68) [64];
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined1 (*local_1b28) [64];
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined1 (*local_1ae8) [64];
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined1 local_1a80 [8];
  float fStack_1a78;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 local_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined1 local_1a30 [8];
  undefined8 uStack_1a28;
  undefined1 local_1a20 [16];
  undefined4 local_1a10;
  undefined4 uStack_1a0c;
  undefined4 uStack_1a08;
  undefined4 uStack_1a04;
  undefined1 local_1a00 [16];
  undefined1 local_19f0 [8];
  undefined8 uStack_19e8;
  undefined1 local_19e0 [8];
  undefined8 uStack_19d8;
  undefined1 local_19d0 [16];
  undefined4 local_19c0;
  undefined4 uStack_19bc;
  undefined4 uStack_19b8;
  undefined4 uStack_19b4;
  undefined8 local_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1990;
  undefined8 uStack_1988;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined1 (*local_1928) [64];
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined1 (*local_1908) [64];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined1 (*local_18e8) [64];
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 local_18d0;
  undefined8 uStack_18c8;
  undefined4 local_18c0;
  undefined4 uStack_18bc;
  undefined4 uStack_18b8;
  undefined4 uStack_18b4;
  undefined8 local_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined1 local_1890 [8];
  float fStack_1888;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined4 local_1500;
  undefined4 uStack_14fc;
  undefined4 uStack_14f8;
  undefined4 uStack_14f4;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  float local_1440 [2];
  float afStack_1438 [2];
  float afStack_1430 [2];
  float afStack_1428 [2];
  float afStack_1420 [2];
  float afStack_1418 [2];
  float afStack_1410 [2];
  float afStack_1408 [2];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  float local_1300 [2];
  float afStack_12f8 [2];
  float afStack_12f0 [2];
  float afStack_12e8 [2];
  float afStack_12e0 [2];
  float afStack_12d8 [2];
  float afStack_12d0 [2];
  float afStack_12c8 [2];
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240 [2];
  float afStack_1238 [2];
  float afStack_1230 [2];
  float afStack_1228 [2];
  float afStack_1220 [2];
  float afStack_1218 [2];
  float afStack_1210 [2];
  float afStack_1208 [2];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  float local_1180 [2];
  float afStack_1178 [2];
  float afStack_1170 [2];
  float afStack_1168 [2];
  float afStack_1160 [2];
  float afStack_1158 [2];
  float afStack_1150 [2];
  float afStack_1148 [2];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  float local_10c0 [2];
  float afStack_10b8 [2];
  float afStack_10b0 [2];
  float afStack_10a8 [2];
  float afStack_10a0 [2];
  float afStack_1098 [2];
  float afStack_1090 [2];
  float afStack_1088 [2];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000 [2];
  float afStack_ff8 [2];
  float afStack_ff0 [2];
  float afStack_fe8 [2];
  float afStack_fe0 [2];
  float afStack_fd8 [2];
  float afStack_fd0 [2];
  float afStack_fc8 [2];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80 [2];
  float afStack_f78 [2];
  float afStack_f70 [2];
  float afStack_f68 [2];
  float afStack_f60 [2];
  float afStack_f58 [2];
  float afStack_f50 [2];
  float afStack_f48 [2];
  float local_f40 [2];
  float afStack_f38 [2];
  float afStack_f30 [2];
  float afStack_f28 [2];
  float afStack_f20 [2];
  float afStack_f18 [2];
  float afStack_f10 [2];
  float afStack_f08 [2];
  float local_f00 [2];
  float afStack_ef8 [2];
  float afStack_ef0 [2];
  float afStack_ee8 [2];
  float afStack_ee0 [2];
  float afStack_ed8 [2];
  float afStack_ed0 [2];
  float afStack_ec8 [2];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80 [2];
  float afStack_e78 [2];
  float afStack_e70 [2];
  float afStack_e68 [2];
  float afStack_e60 [2];
  float afStack_e58 [2];
  float afStack_e50 [2];
  float afStack_e48 [2];
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  ushort local_dc2;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  float local_d80 [2];
  float afStack_d78 [2];
  float afStack_d70 [2];
  float afStack_d68 [2];
  float afStack_d60 [2];
  float afStack_d58 [2];
  float afStack_d50 [2];
  float afStack_d48 [2];
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0 [2];
  float afStack_cb8 [2];
  float afStack_cb0 [2];
  float afStack_ca8 [2];
  float afStack_ca0 [2];
  float afStack_c98 [2];
  float afStack_c90 [2];
  float afStack_c88 [2];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00 [2];
  float afStack_bf8 [2];
  float afStack_bf0 [2];
  float afStack_be8 [2];
  float afStack_be0 [2];
  float afStack_bd8 [2];
  float afStack_bd0 [2];
  float afStack_bc8 [2];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined4 local_a84;
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined4 local_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 uStack_988;
  undefined4 uStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined1 *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  float *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  float *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  float *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  float *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  float *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  float *local_8b8;
  float *local_8b0;
  undefined1 *local_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 *local_850;
  float *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  float *local_830;
  undefined1 *local_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined4 local_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760 [2];
  float afStack_758 [2];
  float afStack_750 [2];
  float afStack_748 [2];
  float local_740 [2];
  float afStack_738 [2];
  float afStack_730 [2];
  float afStack_728 [2];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float local_700 [2];
  float afStack_6f8 [2];
  float afStack_6f0 [2];
  float afStack_6e8 [2];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0 [2];
  float afStack_698 [2];
  float afStack_690 [2];
  float afStack_688 [2];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_640 [2];
  float afStack_638 [2];
  float afStack_630 [2];
  float afStack_628 [2];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0 [2];
  float afStack_5d8 [2];
  float afStack_5d0 [2];
  float afStack_5c8 [2];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  float local_580 [2];
  float afStack_578 [2];
  float afStack_570 [2];
  float afStack_568 [2];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0 [2];
  float afStack_498 [2];
  float afStack_490 [2];
  float afStack_488 [2];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  float local_440 [2];
  float afStack_438 [2];
  float afStack_430 [2];
  float afStack_428 [2];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined4 local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [16];
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2e0;
  float *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  float *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  float *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  float *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  float *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  float *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190 [2];
  float afStack_188 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0 [2];
  float afStack_a8 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  for (local_26ec = 0; local_26ec < in_ESI; local_26ec = local_26ec + 1) {
    local_26f8 = (undefined1 (*) [64])(in_RDI + (long)(local_26ec * in_EDX) * 4);
    local_2700 = in_R8;
    for (local_2704 = 0; local_2704 + 0xf < in_ECX; local_2704 = local_2704 + 0x10) {
      auVar77 = vmaxps_avx512f(*local_2700,*local_26f8);
      *local_2700 = auVar77;
      local_26f8 = local_26f8 + 1;
      local_2700 = local_2700 + 1;
    }
    for (; local_2704 + 7 < in_ECX; local_2704 = local_2704 + 8) {
      auVar19 = vmaxps_avx(*(undefined1 (*) [32])*local_2700,*(undefined1 (*) [32])*local_26f8);
      local_1ae8 = local_2700;
      local_2800 = auVar19._0_8_;
      local_1b20 = local_2800;
      uStack_27f8 = auVar19._8_8_;
      uStack_1b18 = uStack_27f8;
      uStack_27f0 = auVar19._16_8_;
      uStack_1b10 = uStack_27f0;
      uStack_27e8 = auVar19._24_8_;
      uStack_1b08 = uStack_27e8;
      *(undefined1 (*) [32])*local_2700 = auVar19;
      local_26f8 = (undefined1 (*) [64])(*local_26f8 + 0x20);
      local_2700 = (undefined1 (*) [64])(*local_2700 + 0x20);
    }
    for (; local_2704 + 3 < in_ECX; local_2704 = local_2704 + 4) {
      auVar17 = vmaxps_avx(*(undefined1 (*) [16])*local_2700,*(undefined1 (*) [16])*local_26f8);
      local_18e8 = local_2700;
      local_2820 = auVar17._0_8_;
      local_1900 = local_2820;
      uStack_2818 = auVar17._8_8_;
      uStack_18f8 = uStack_2818;
      *(undefined1 (*) [16])*local_2700 = auVar17;
      local_26f8 = (undefined1 (*) [64])(*local_26f8 + 0x10);
      local_2700 = (undefined1 (*) [64])(*local_2700 + 0x10);
    }
    for (; local_2704 < in_ECX; local_2704 = local_2704 + 1) {
      pfVar76 = std::max<float>((float *)local_2700,(float *)local_26f8);
      *(float *)*local_2700 = *pfVar76;
      local_26f8 = (undefined1 (*) [64])(*local_26f8 + 4);
      local_2700 = (undefined1 (*) [64])(*local_2700 + 4);
    }
  }
  for (local_2824 = 0; local_2824 < in_ESI; local_2824 = local_2824 + 1) {
    local_2830 = (undefined1 (*) [64])(in_RDI + (long)(local_2824 * in_EDX) * 4);
    local_2840 = in_R9;
    local_2838 = in_R8;
    for (local_2844 = 0; local_2844 + 0xf < in_ECX; local_2844 = local_2844 + 0x10) {
      auVar70 = *local_2840;
      auVar77 = vsubps_avx512f(*local_2830,*local_2838);
      local_28c0 = auVar77._0_8_;
      uStack_28b8 = auVar77._8_8_;
      uStack_28b0 = auVar77._16_8_;
      uStack_28a8 = auVar77._24_8_;
      uStack_28a0 = auVar77._32_8_;
      uStack_2898 = auVar77._40_8_;
      uStack_2890 = auVar77._48_8_;
      uStack_2888 = auVar77._56_8_;
      local_1480 = 0;
      uStack_1478 = 0;
      uStack_1470 = 0;
      uStack_1468 = 0;
      uStack_1460 = 0;
      uStack_1458 = 0;
      uStack_1450 = 0;
      uStack_1448 = 0;
      local_1400 = local_28c0;
      uStack_13f8 = uStack_28b8;
      uStack_13f0 = uStack_28b0;
      uStack_13e8 = uStack_28a8;
      uStack_13e0 = uStack_28a0;
      uStack_13d8 = uStack_2898;
      uStack_13d0 = uStack_2890;
      uStack_13c8 = uStack_2888;
      local_1440[0] = 88.37626;
      local_1440[1] = 88.37626;
      afStack_1438[0] = 88.37626;
      afStack_1438[1] = 88.37626;
      afStack_1430[0] = 88.37626;
      afStack_1430[1] = 88.37626;
      afStack_1428[0] = 88.37626;
      afStack_1428[1] = 88.37626;
      afStack_1420[0] = 88.37626;
      afStack_1420[1] = 88.37626;
      afStack_1418[0] = 88.37626;
      afStack_1418[1] = 88.37626;
      afStack_1410[0] = 88.37626;
      afStack_1410[1] = 88.37626;
      afStack_1408[0] = 88.37626;
      afStack_1408[1] = 88.37626;
      auVar79._8_4_ = 88.37626;
      auVar79._12_4_ = 88.37626;
      auVar79._0_4_ = 88.37626;
      auVar79._4_4_ = 88.37626;
      auVar79._16_4_ = 88.37626;
      auVar79._20_4_ = 88.37626;
      auVar79._24_4_ = 88.37626;
      auVar79._28_4_ = 88.37626;
      auVar79._32_4_ = 88.37626;
      auVar79._36_4_ = 88.37626;
      auVar79._40_4_ = 88.37626;
      auVar79._44_4_ = 88.37626;
      auVar79._48_4_ = 88.37626;
      auVar79._52_4_ = 88.37626;
      auVar79._56_4_ = 88.37626;
      auVar79._60_4_ = 88.37626;
      auVar78 = vminps_avx512f(auVar77,auVar79);
      auVar77._8_4_ = -88.37626;
      auVar77._12_4_ = -88.37626;
      auVar77._0_4_ = -88.37626;
      auVar77._4_4_ = -88.37626;
      auVar77._16_4_ = -88.37626;
      auVar77._20_4_ = -88.37626;
      auVar77._24_4_ = -88.37626;
      auVar77._28_4_ = -88.37626;
      auVar77._32_4_ = -88.37626;
      auVar77._36_4_ = -88.37626;
      auVar77._40_4_ = -88.37626;
      auVar77._44_4_ = -88.37626;
      auVar77._48_4_ = -88.37626;
      auVar77._52_4_ = -88.37626;
      auVar77._56_4_ = -88.37626;
      auVar77._60_4_ = -88.37626;
      auVar78 = vmaxps_avx512f(auVar78,auVar77);
      local_2240 = auVar78._0_8_;
      local_ec0 = local_2240;
      uStack_2238 = auVar78._8_8_;
      uStack_eb8 = uStack_2238;
      uStack_2230 = auVar78._16_8_;
      uStack_eb0 = uStack_2230;
      uStack_2228 = auVar78._24_8_;
      uStack_ea8 = uStack_2228;
      uStack_2220 = auVar78._32_8_;
      uStack_ea0 = uStack_2220;
      uStack_2218 = auVar78._40_8_;
      uStack_e98 = uStack_2218;
      uStack_2210 = auVar78._48_8_;
      uStack_e90 = uStack_2210;
      uStack_2208 = auVar78._56_8_;
      uStack_e88 = uStack_2208;
      local_f00[0] = 1.442695;
      local_f00[1] = 1.442695;
      afStack_ef8[0] = 1.442695;
      afStack_ef8[1] = 1.442695;
      afStack_ef0[0] = 1.442695;
      afStack_ef0[1] = 1.442695;
      afStack_ee8[0] = 1.442695;
      afStack_ee8[1] = 1.442695;
      afStack_ee0[0] = 1.442695;
      afStack_ee0[1] = 1.442695;
      afStack_ed8[0] = 1.442695;
      afStack_ed8[1] = 1.442695;
      afStack_ed0[0] = 1.442695;
      afStack_ed0[1] = 1.442695;
      afStack_ec8[0] = 1.442695;
      afStack_ec8[1] = 1.442695;
      local_f40[0] = 0.5;
      local_f40[1] = 0.5;
      afStack_f38[0] = 0.5;
      afStack_f38[1] = 0.5;
      afStack_f30[0] = 0.5;
      afStack_f30[1] = 0.5;
      afStack_f28[0] = 0.5;
      afStack_f28[1] = 0.5;
      afStack_f20[0] = 0.5;
      afStack_f20[1] = 0.5;
      afStack_f18[0] = 0.5;
      afStack_f18[1] = 0.5;
      afStack_f10[0] = 0.5;
      afStack_f10[1] = 0.5;
      afStack_f08[0] = 0.5;
      afStack_f08[1] = 0.5;
      auVar37._8_4_ = 1.442695;
      auVar37._12_4_ = 1.442695;
      auVar37._0_4_ = 1.442695;
      auVar37._4_4_ = 1.442695;
      auVar37._16_4_ = 1.442695;
      auVar37._20_4_ = 1.442695;
      auVar37._24_4_ = 1.442695;
      auVar37._28_4_ = 1.442695;
      auVar37._32_4_ = 1.442695;
      auVar37._36_4_ = 1.442695;
      auVar37._40_4_ = 1.442695;
      auVar37._44_4_ = 1.442695;
      auVar37._48_4_ = 1.442695;
      auVar37._52_4_ = 1.442695;
      auVar37._56_4_ = 1.442695;
      auVar37._60_4_ = 1.442695;
      auVar36._8_4_ = 0.5;
      auVar36._12_4_ = 0.5;
      auVar36._0_4_ = 0.5;
      auVar36._4_4_ = 0.5;
      auVar36._16_4_ = 0.5;
      auVar36._20_4_ = 0.5;
      auVar36._24_4_ = 0.5;
      auVar36._28_4_ = 0.5;
      auVar36._32_4_ = 0.5;
      auVar36._36_4_ = 0.5;
      auVar36._40_4_ = 0.5;
      auVar36._44_4_ = 0.5;
      auVar36._48_4_ = 0.5;
      auVar36._52_4_ = 0.5;
      auVar36._56_4_ = 0.5;
      auVar36._60_4_ = 0.5;
      auVar77 = vfmadd213ps_avx512f(auVar37,auVar78,auVar36);
      auVar79 = vrndscaleps_avx512f(auVar77,1);
      uVar22 = vcmpps_avx512f(auVar77,auVar79,1);
      local_dc2 = (ushort)uVar22;
      local_2280 = auVar79._0_8_;
      local_e40 = local_2280;
      uStack_2278 = auVar79._8_8_;
      uStack_e38 = uStack_2278;
      uStack_2270 = auVar79._16_8_;
      uStack_e30 = uStack_2270;
      uStack_2268 = auVar79._24_8_;
      uStack_e28 = uStack_2268;
      uStack_2260 = auVar79._32_8_;
      uStack_e20 = uStack_2260;
      uStack_2258 = auVar79._40_8_;
      uStack_e18 = uStack_2258;
      uStack_2250 = auVar79._48_8_;
      uStack_e10 = uStack_2250;
      uStack_2248 = auVar79._56_8_;
      uStack_e08 = uStack_2248;
      local_e80[0] = 1.0;
      local_e80[1] = 1.0;
      afStack_e78[0] = 1.0;
      afStack_e78[1] = 1.0;
      afStack_e70[0] = 1.0;
      afStack_e70[1] = 1.0;
      afStack_e68[0] = 1.0;
      afStack_e68[1] = 1.0;
      afStack_e60[0] = 1.0;
      afStack_e60[1] = 1.0;
      afStack_e58[0] = 1.0;
      afStack_e58[1] = 1.0;
      afStack_e50[0] = 1.0;
      afStack_e50[1] = 1.0;
      afStack_e48[0] = 1.0;
      afStack_e48[1] = 1.0;
      local_d40 = local_2280;
      uStack_d38 = uStack_2278;
      uStack_d30 = uStack_2270;
      uStack_d28 = uStack_2268;
      uStack_d20 = uStack_2260;
      uStack_d18 = uStack_2258;
      uStack_d10 = uStack_2250;
      uStack_d08 = uStack_2248;
      local_d80[0] = 1.0;
      local_d80[1] = 1.0;
      afStack_d78[0] = 1.0;
      afStack_d78[1] = 1.0;
      afStack_d70[0] = 1.0;
      afStack_d70[1] = 1.0;
      afStack_d68[0] = 1.0;
      afStack_d68[1] = 1.0;
      afStack_d60[0] = 1.0;
      afStack_d60[1] = 1.0;
      afStack_d58[0] = 1.0;
      afStack_d58[1] = 1.0;
      afStack_d50[0] = 1.0;
      afStack_d50[1] = 1.0;
      afStack_d48[0] = 1.0;
      afStack_d48[1] = 1.0;
      auVar38._8_4_ = 1.0;
      auVar38._12_4_ = 1.0;
      auVar38._0_4_ = 1.0;
      auVar38._4_4_ = 1.0;
      auVar38._16_4_ = 1.0;
      auVar38._20_4_ = 1.0;
      auVar38._24_4_ = 1.0;
      auVar38._28_4_ = 1.0;
      auVar38._32_4_ = 1.0;
      auVar38._36_4_ = 1.0;
      auVar38._40_4_ = 1.0;
      auVar38._44_4_ = 1.0;
      auVar38._48_4_ = 1.0;
      auVar38._52_4_ = 1.0;
      auVar38._56_4_ = 1.0;
      auVar38._60_4_ = 1.0;
      local_dc0._0_4_ = auVar79._0_4_;
      local_dc0._4_4_ = auVar79._4_4_;
      uStack_db8._0_4_ = auVar79._8_4_;
      uStack_db8._4_4_ = auVar79._12_4_;
      uStack_db0._0_4_ = auVar79._16_4_;
      uStack_db0._4_4_ = auVar79._20_4_;
      uStack_da8._0_4_ = auVar79._24_4_;
      uStack_da8._4_4_ = auVar79._28_4_;
      uStack_da0._0_4_ = auVar79._32_4_;
      uStack_da0._4_4_ = auVar79._36_4_;
      uStack_d98._0_4_ = auVar79._40_4_;
      uStack_d98._4_4_ = auVar79._44_4_;
      uStack_d90._0_4_ = auVar79._48_4_;
      uStack_d90._4_4_ = auVar79._52_4_;
      uStack_d88._0_4_ = auVar79._56_4_;
      uStack_d88._4_4_ = auVar79._60_4_;
      auVar77 = vsubps_avx512f(auVar79,auVar38);
      bVar1 = (bool)((byte)uVar22 & 1);
      bVar2 = (bool)((byte)(local_dc2 >> 1) & 1);
      bVar3 = (bool)((byte)(local_dc2 >> 2) & 1);
      bVar4 = (bool)((byte)(local_dc2 >> 3) & 1);
      bVar5 = (bool)((byte)(local_dc2 >> 4) & 1);
      bVar6 = (bool)((byte)(local_dc2 >> 5) & 1);
      bVar7 = (bool)((byte)(local_dc2 >> 6) & 1);
      bVar8 = (bool)((byte)(local_dc2 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar22 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_22c0._4_4_ = (uint)bVar2 * auVar77._4_4_ | (uint)!bVar2 * local_dc0._4_4_;
      local_22c0._0_4_ = (uint)bVar1 * auVar77._0_4_ | (uint)!bVar1 * (int)local_dc0;
      local_22c0._8_4_ = (uint)bVar3 * auVar77._8_4_ | (uint)!bVar3 * (int)uStack_db8;
      local_22c0._12_4_ = (uint)bVar4 * auVar77._12_4_ | (uint)!bVar4 * uStack_db8._4_4_;
      uStack_22b0._0_4_ = (uint)bVar5 * auVar77._16_4_ | (uint)!bVar5 * (int)uStack_db0;
      uStack_22b0._4_4_ = (uint)bVar6 * auVar77._20_4_ | (uint)!bVar6 * uStack_db0._4_4_;
      auVar71 = _local_22c0;
      uStack_22a8._0_4_ = (uint)bVar7 * auVar77._24_4_ | (uint)!bVar7 * (int)uStack_da8;
      uStack_22a8._4_4_ = (uint)bVar8 * auVar77._28_4_ | (uint)!bVar8 * uStack_da8._4_4_;
      auVar19 = _local_22c0;
      uStack_22a0._0_4_ =
           (uint)(bVar9 & 1) * auVar77._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_da0;
      uStack_22a0._4_4_ = (uint)bVar10 * auVar77._36_4_ | (uint)!bVar10 * uStack_da0._4_4_;
      auVar72 = _local_22c0;
      uStack_2298._0_4_ = (uint)bVar11 * auVar77._40_4_ | (uint)!bVar11 * (int)uStack_d98;
      uStack_2298._4_4_ = (uint)bVar12 * auVar77._44_4_ | (uint)!bVar12 * uStack_d98._4_4_;
      auVar73 = _local_22c0;
      uStack_2290._0_4_ = (uint)bVar13 * auVar77._48_4_ | (uint)!bVar13 * (int)uStack_d90;
      uStack_2290._4_4_ = (uint)bVar14 * auVar77._52_4_ | (uint)!bVar14 * uStack_d90._4_4_;
      auVar74 = _local_22c0;
      uStack_2288._0_4_ = (uint)bVar15 * auVar77._56_4_ | (uint)!bVar15 * (int)uStack_d88;
      uStack_2288._4_4_ =
           (uint)(bVar9 >> 7) * auVar77._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_d88._4_4_;
      auVar77 = _local_22c0;
      local_bc0 = local_22c0._0_8_;
      uStack_bb8 = local_22c0._8_8_;
      uStack_22b0 = auVar71._16_8_;
      uStack_bb0 = uStack_22b0;
      uStack_22a8 = auVar19._24_8_;
      uStack_ba8 = uStack_22a8;
      uStack_22a0 = auVar72._32_8_;
      uStack_ba0 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_b98 = uStack_2298;
      uStack_2290 = auVar74._48_8_;
      uStack_b90 = uStack_2290;
      uStack_2288 = auVar77._56_8_;
      uStack_b88 = uStack_2288;
      local_c00[0] = 0.6933594;
      local_c00[1] = 0.6933594;
      afStack_bf8[0] = 0.6933594;
      afStack_bf8[1] = 0.6933594;
      afStack_bf0[0] = 0.6933594;
      afStack_bf0[1] = 0.6933594;
      afStack_be8[0] = 0.6933594;
      afStack_be8[1] = 0.6933594;
      afStack_be0[0] = 0.6933594;
      afStack_be0[1] = 0.6933594;
      afStack_bd8[0] = 0.6933594;
      afStack_bd8[1] = 0.6933594;
      afStack_bd0[0] = 0.6933594;
      afStack_bd0[1] = 0.6933594;
      afStack_bc8[0] = 0.6933594;
      afStack_bc8[1] = 0.6933594;
      local_c40 = local_2240;
      uStack_c38 = uStack_2238;
      uStack_c30 = uStack_2230;
      uStack_c28 = uStack_2228;
      uStack_c20 = uStack_2220;
      uStack_c18 = uStack_2218;
      uStack_c10 = uStack_2210;
      uStack_c08 = uStack_2208;
      auVar42._16_8_ = uStack_22b0;
      auVar42._0_16_ = local_22c0;
      auVar42._24_8_ = uStack_22a8;
      auVar42._32_8_ = uStack_22a0;
      auVar42._40_8_ = uStack_2298;
      auVar42._48_8_ = uStack_2290;
      auVar42._56_8_ = uStack_2288;
      auVar41._8_4_ = 0.6933594;
      auVar41._12_4_ = 0.6933594;
      auVar41._0_4_ = 0.6933594;
      auVar41._4_4_ = 0.6933594;
      auVar41._16_4_ = 0.6933594;
      auVar41._20_4_ = 0.6933594;
      auVar41._24_4_ = 0.6933594;
      auVar41._28_4_ = 0.6933594;
      auVar41._32_4_ = 0.6933594;
      auVar41._36_4_ = 0.6933594;
      auVar41._40_4_ = 0.6933594;
      auVar41._44_4_ = 0.6933594;
      auVar41._48_4_ = 0.6933594;
      auVar41._52_4_ = 0.6933594;
      auVar41._56_4_ = 0.6933594;
      auVar41._60_4_ = 0.6933594;
      auVar77 = vfnmadd213ps_avx512f(auVar41,auVar42,auVar78);
      local_c80 = local_22c0._0_8_;
      uStack_c78 = local_22c0._8_8_;
      uStack_c70 = uStack_22b0;
      uStack_c68 = uStack_22a8;
      uStack_c60 = uStack_22a0;
      uStack_c58 = uStack_2298;
      uStack_c50 = uStack_2290;
      uStack_c48 = uStack_2288;
      local_cc0[0] = -0.00021219444;
      local_cc0[1] = -0.00021219444;
      afStack_cb8[0] = -0.00021219444;
      afStack_cb8[1] = -0.00021219444;
      afStack_cb0[0] = -0.00021219444;
      afStack_cb0[1] = -0.00021219444;
      afStack_ca8[0] = -0.00021219444;
      afStack_ca8[1] = -0.00021219444;
      afStack_ca0[0] = -0.00021219444;
      afStack_ca0[1] = -0.00021219444;
      afStack_c98[0] = -0.00021219444;
      afStack_c98[1] = -0.00021219444;
      afStack_c90[0] = -0.00021219444;
      afStack_c90[1] = -0.00021219444;
      afStack_c88[0] = -0.00021219444;
      afStack_c88[1] = -0.00021219444;
      local_2240 = auVar77._0_8_;
      local_d00 = local_2240;
      uStack_2238 = auVar77._8_8_;
      uStack_cf8 = uStack_2238;
      uStack_2230 = auVar77._16_8_;
      uStack_cf0 = uStack_2230;
      uStack_2228 = auVar77._24_8_;
      uStack_ce8 = uStack_2228;
      uStack_2220 = auVar77._32_8_;
      uStack_ce0 = uStack_2220;
      uStack_2218 = auVar77._40_8_;
      uStack_cd8 = uStack_2218;
      uStack_2210 = auVar77._48_8_;
      uStack_cd0 = uStack_2210;
      uStack_2208 = auVar77._56_8_;
      uStack_cc8 = uStack_2208;
      auVar40._16_8_ = uStack_22b0;
      auVar40._0_16_ = local_22c0;
      auVar40._24_8_ = uStack_22a8;
      auVar40._32_8_ = uStack_22a0;
      auVar40._40_8_ = uStack_2298;
      auVar40._48_8_ = uStack_2290;
      auVar40._56_8_ = uStack_2288;
      auVar39._8_4_ = -0.00021219444;
      auVar39._12_4_ = -0.00021219444;
      auVar39._0_4_ = -0.00021219444;
      auVar39._4_4_ = -0.00021219444;
      auVar39._16_4_ = -0.00021219444;
      auVar39._20_4_ = -0.00021219444;
      auVar39._24_4_ = -0.00021219444;
      auVar39._28_4_ = -0.00021219444;
      auVar39._32_4_ = -0.00021219444;
      auVar39._36_4_ = -0.00021219444;
      auVar39._40_4_ = -0.00021219444;
      auVar39._44_4_ = -0.00021219444;
      auVar39._48_4_ = -0.00021219444;
      auVar39._52_4_ = -0.00021219444;
      auVar39._56_4_ = -0.00021219444;
      auVar39._60_4_ = -0.00021219444;
      auVar77 = vfnmadd213ps_avx512f(auVar39,auVar40,auVar77);
      local_2240 = auVar77._0_8_;
      local_1700 = local_2240;
      uStack_2238 = auVar77._8_8_;
      uStack_16f8 = uStack_2238;
      uStack_2230 = auVar77._16_8_;
      uStack_16f0 = uStack_2230;
      uStack_2228 = auVar77._24_8_;
      uStack_16e8 = uStack_2228;
      uStack_2220 = auVar77._32_8_;
      uStack_16e0 = uStack_2220;
      uStack_2218 = auVar77._40_8_;
      uStack_16d8 = uStack_2218;
      uStack_2210 = auVar77._48_8_;
      uStack_16d0 = uStack_2210;
      uStack_2208 = auVar77._56_8_;
      uStack_16c8 = uStack_2208;
      auVar78 = vmulps_avx512f(auVar77,auVar77);
      uStack_23b8._0_4_ = 0.00019875691;
      uStack_23b8._4_4_ = 0.00019875691;
      local_23c0._0_4_ = 0.00019875691;
      local_23c0._4_4_ = 0.00019875691;
      local_f80[0] = 0.00019875691;
      local_f80[1] = 0.00019875691;
      afStack_f78[0] = 0.00019875691;
      afStack_f78[1] = 0.00019875691;
      afStack_f70[0] = 0.00019875691;
      afStack_f70[1] = 0.00019875691;
      afStack_f68[0] = 0.00019875691;
      afStack_f68[1] = 0.00019875691;
      afStack_f60[0] = 0.00019875691;
      afStack_f60[1] = 0.00019875691;
      afStack_f58[0] = 0.00019875691;
      afStack_f58[1] = 0.00019875691;
      afStack_f50[0] = 0.00019875691;
      afStack_f50[1] = 0.00019875691;
      afStack_f48[0] = 0.00019875691;
      afStack_f48[1] = 0.00019875691;
      local_fc0 = local_2240;
      uStack_fb8 = uStack_2238;
      uStack_fb0 = uStack_2230;
      uStack_fa8 = uStack_2228;
      uStack_fa0 = uStack_2220;
      uStack_f98 = uStack_2218;
      uStack_f90 = uStack_2210;
      uStack_f88 = uStack_2208;
      local_1000[0] = 0.0013981999;
      local_1000[1] = 0.0013981999;
      afStack_ff8[0] = 0.0013981999;
      afStack_ff8[1] = 0.0013981999;
      afStack_ff0[0] = 0.0013981999;
      afStack_ff0[1] = 0.0013981999;
      afStack_fe8[0] = 0.0013981999;
      afStack_fe8[1] = 0.0013981999;
      afStack_fe0[0] = 0.0013981999;
      afStack_fe0[1] = 0.0013981999;
      afStack_fd8[0] = 0.0013981999;
      afStack_fd8[1] = 0.0013981999;
      afStack_fd0[0] = 0.0013981999;
      afStack_fd0[1] = 0.0013981999;
      afStack_fc8[0] = 0.0013981999;
      afStack_fc8[1] = 0.0013981999;
      auVar35._16_4_ = 0.00019875691;
      auVar35._20_4_ = 0.00019875691;
      auVar35._0_16_ = _local_23c0;
      auVar35._24_4_ = 0.00019875691;
      auVar35._28_4_ = 0.00019875691;
      auVar35._32_4_ = 0.00019875691;
      auVar35._36_4_ = 0.00019875691;
      auVar35._40_4_ = 0.00019875691;
      auVar35._44_4_ = 0.00019875691;
      auVar35._48_4_ = 0.00019875691;
      auVar35._52_4_ = 0.00019875691;
      auVar35._56_4_ = 0.00019875691;
      auVar35._60_4_ = 0.00019875691;
      auVar34._8_4_ = 0.0013981999;
      auVar34._12_4_ = 0.0013981999;
      auVar34._0_4_ = 0.0013981999;
      auVar34._4_4_ = 0.0013981999;
      auVar34._16_4_ = 0.0013981999;
      auVar34._20_4_ = 0.0013981999;
      auVar34._24_4_ = 0.0013981999;
      auVar34._28_4_ = 0.0013981999;
      auVar34._32_4_ = 0.0013981999;
      auVar34._36_4_ = 0.0013981999;
      auVar34._40_4_ = 0.0013981999;
      auVar34._44_4_ = 0.0013981999;
      auVar34._48_4_ = 0.0013981999;
      auVar34._52_4_ = 0.0013981999;
      auVar34._56_4_ = 0.0013981999;
      auVar34._60_4_ = 0.0013981999;
      auVar79 = vfmadd213ps_avx512f(auVar77,auVar35,auVar34);
      local_23c0 = auVar79._0_8_;
      local_1040 = local_23c0;
      uStack_23b8 = auVar79._8_8_;
      uStack_1038 = uStack_23b8;
      uStack_23b0 = auVar79._16_8_;
      uStack_1030 = uStack_23b0;
      uStack_23a8 = auVar79._24_8_;
      uStack_1028 = uStack_23a8;
      uStack_23a0 = auVar79._32_8_;
      uStack_1020 = uStack_23a0;
      uStack_2398 = auVar79._40_8_;
      uStack_1018 = uStack_2398;
      uStack_2390 = auVar79._48_8_;
      uStack_1010 = uStack_2390;
      uStack_2388 = auVar79._56_8_;
      uStack_1008 = uStack_2388;
      local_1080 = local_2240;
      uStack_1078 = uStack_2238;
      uStack_1070 = uStack_2230;
      uStack_1068 = uStack_2228;
      uStack_1060 = uStack_2220;
      uStack_1058 = uStack_2218;
      uStack_1050 = uStack_2210;
      uStack_1048 = uStack_2208;
      local_10c0[0] = 0.008333452;
      local_10c0[1] = 0.008333452;
      afStack_10b8[0] = 0.008333452;
      afStack_10b8[1] = 0.008333452;
      afStack_10b0[0] = 0.008333452;
      afStack_10b0[1] = 0.008333452;
      afStack_10a8[0] = 0.008333452;
      afStack_10a8[1] = 0.008333452;
      afStack_10a0[0] = 0.008333452;
      afStack_10a0[1] = 0.008333452;
      afStack_1098[0] = 0.008333452;
      afStack_1098[1] = 0.008333452;
      afStack_1090[0] = 0.008333452;
      afStack_1090[1] = 0.008333452;
      afStack_1088[0] = 0.008333452;
      afStack_1088[1] = 0.008333452;
      auVar33._8_4_ = 0.008333452;
      auVar33._12_4_ = 0.008333452;
      auVar33._0_4_ = 0.008333452;
      auVar33._4_4_ = 0.008333452;
      auVar33._16_4_ = 0.008333452;
      auVar33._20_4_ = 0.008333452;
      auVar33._24_4_ = 0.008333452;
      auVar33._28_4_ = 0.008333452;
      auVar33._32_4_ = 0.008333452;
      auVar33._36_4_ = 0.008333452;
      auVar33._40_4_ = 0.008333452;
      auVar33._44_4_ = 0.008333452;
      auVar33._48_4_ = 0.008333452;
      auVar33._52_4_ = 0.008333452;
      auVar33._56_4_ = 0.008333452;
      auVar33._60_4_ = 0.008333452;
      auVar79 = vfmadd213ps_avx512f(auVar77,auVar79,auVar33);
      local_23c0 = auVar79._0_8_;
      local_1100 = local_23c0;
      uStack_23b8 = auVar79._8_8_;
      uStack_10f8 = uStack_23b8;
      uStack_23b0 = auVar79._16_8_;
      uStack_10f0 = uStack_23b0;
      uStack_23a8 = auVar79._24_8_;
      uStack_10e8 = uStack_23a8;
      uStack_23a0 = auVar79._32_8_;
      uStack_10e0 = uStack_23a0;
      uStack_2398 = auVar79._40_8_;
      uStack_10d8 = uStack_2398;
      uStack_2390 = auVar79._48_8_;
      uStack_10d0 = uStack_2390;
      uStack_2388 = auVar79._56_8_;
      uStack_10c8 = uStack_2388;
      local_1140 = local_2240;
      uStack_1138 = uStack_2238;
      uStack_1130 = uStack_2230;
      uStack_1128 = uStack_2228;
      uStack_1120 = uStack_2220;
      uStack_1118 = uStack_2218;
      uStack_1110 = uStack_2210;
      uStack_1108 = uStack_2208;
      local_1180[0] = 0.041665796;
      local_1180[1] = 0.041665796;
      afStack_1178[0] = 0.041665796;
      afStack_1178[1] = 0.041665796;
      afStack_1170[0] = 0.041665796;
      afStack_1170[1] = 0.041665796;
      afStack_1168[0] = 0.041665796;
      afStack_1168[1] = 0.041665796;
      afStack_1160[0] = 0.041665796;
      afStack_1160[1] = 0.041665796;
      afStack_1158[0] = 0.041665796;
      afStack_1158[1] = 0.041665796;
      afStack_1150[0] = 0.041665796;
      afStack_1150[1] = 0.041665796;
      afStack_1148[0] = 0.041665796;
      afStack_1148[1] = 0.041665796;
      auVar32._8_4_ = 0.041665796;
      auVar32._12_4_ = 0.041665796;
      auVar32._0_4_ = 0.041665796;
      auVar32._4_4_ = 0.041665796;
      auVar32._16_4_ = 0.041665796;
      auVar32._20_4_ = 0.041665796;
      auVar32._24_4_ = 0.041665796;
      auVar32._28_4_ = 0.041665796;
      auVar32._32_4_ = 0.041665796;
      auVar32._36_4_ = 0.041665796;
      auVar32._40_4_ = 0.041665796;
      auVar32._44_4_ = 0.041665796;
      auVar32._48_4_ = 0.041665796;
      auVar32._52_4_ = 0.041665796;
      auVar32._56_4_ = 0.041665796;
      auVar32._60_4_ = 0.041665796;
      auVar79 = vfmadd213ps_avx512f(auVar77,auVar79,auVar32);
      local_23c0 = auVar79._0_8_;
      local_11c0 = local_23c0;
      uStack_23b8 = auVar79._8_8_;
      uStack_11b8 = uStack_23b8;
      uStack_23b0 = auVar79._16_8_;
      uStack_11b0 = uStack_23b0;
      uStack_23a8 = auVar79._24_8_;
      uStack_11a8 = uStack_23a8;
      uStack_23a0 = auVar79._32_8_;
      uStack_11a0 = uStack_23a0;
      uStack_2398 = auVar79._40_8_;
      uStack_1198 = uStack_2398;
      uStack_2390 = auVar79._48_8_;
      uStack_1190 = uStack_2390;
      uStack_2388 = auVar79._56_8_;
      uStack_1188 = uStack_2388;
      local_1200 = local_2240;
      uStack_11f8 = uStack_2238;
      uStack_11f0 = uStack_2230;
      uStack_11e8 = uStack_2228;
      uStack_11e0 = uStack_2220;
      uStack_11d8 = uStack_2218;
      uStack_11d0 = uStack_2210;
      uStack_11c8 = uStack_2208;
      local_1240[0] = 0.16666666;
      local_1240[1] = 0.16666666;
      afStack_1238[0] = 0.16666666;
      afStack_1238[1] = 0.16666666;
      afStack_1230[0] = 0.16666666;
      afStack_1230[1] = 0.16666666;
      afStack_1228[0] = 0.16666666;
      afStack_1228[1] = 0.16666666;
      afStack_1220[0] = 0.16666666;
      afStack_1220[1] = 0.16666666;
      afStack_1218[0] = 0.16666666;
      afStack_1218[1] = 0.16666666;
      afStack_1210[0] = 0.16666666;
      afStack_1210[1] = 0.16666666;
      afStack_1208[0] = 0.16666666;
      afStack_1208[1] = 0.16666666;
      auVar31._8_4_ = 0.16666666;
      auVar31._12_4_ = 0.16666666;
      auVar31._0_4_ = 0.16666666;
      auVar31._4_4_ = 0.16666666;
      auVar31._16_4_ = 0.16666666;
      auVar31._20_4_ = 0.16666666;
      auVar31._24_4_ = 0.16666666;
      auVar31._28_4_ = 0.16666666;
      auVar31._32_4_ = 0.16666666;
      auVar31._36_4_ = 0.16666666;
      auVar31._40_4_ = 0.16666666;
      auVar31._44_4_ = 0.16666666;
      auVar31._48_4_ = 0.16666666;
      auVar31._52_4_ = 0.16666666;
      auVar31._56_4_ = 0.16666666;
      auVar31._60_4_ = 0.16666666;
      auVar79 = vfmadd213ps_avx512f(auVar77,auVar79,auVar31);
      local_23c0 = auVar79._0_8_;
      local_1280 = local_23c0;
      uStack_23b8 = auVar79._8_8_;
      uStack_1278 = uStack_23b8;
      uStack_23b0 = auVar79._16_8_;
      uStack_1270 = uStack_23b0;
      uStack_23a8 = auVar79._24_8_;
      uStack_1268 = uStack_23a8;
      uStack_23a0 = auVar79._32_8_;
      uStack_1260 = uStack_23a0;
      uStack_2398 = auVar79._40_8_;
      uStack_1258 = uStack_2398;
      uStack_2390 = auVar79._48_8_;
      uStack_1250 = uStack_2390;
      uStack_2388 = auVar79._56_8_;
      uStack_1248 = uStack_2388;
      local_12c0 = local_2240;
      uStack_12b8 = uStack_2238;
      uStack_12b0 = uStack_2230;
      uStack_12a8 = uStack_2228;
      uStack_12a0 = uStack_2220;
      uStack_1298 = uStack_2218;
      uStack_1290 = uStack_2210;
      uStack_1288 = uStack_2208;
      local_1300[0] = 0.5;
      local_1300[1] = 0.5;
      afStack_12f8[0] = 0.5;
      afStack_12f8[1] = 0.5;
      afStack_12f0[0] = 0.5;
      afStack_12f0[1] = 0.5;
      afStack_12e8[0] = 0.5;
      afStack_12e8[1] = 0.5;
      afStack_12e0[0] = 0.5;
      afStack_12e0[1] = 0.5;
      afStack_12d8[0] = 0.5;
      afStack_12d8[1] = 0.5;
      afStack_12d0[0] = 0.5;
      afStack_12d0[1] = 0.5;
      afStack_12c8[0] = 0.5;
      afStack_12c8[1] = 0.5;
      auVar30._8_4_ = 0.5;
      auVar30._12_4_ = 0.5;
      auVar30._0_4_ = 0.5;
      auVar30._4_4_ = 0.5;
      auVar30._16_4_ = 0.5;
      auVar30._20_4_ = 0.5;
      auVar30._24_4_ = 0.5;
      auVar30._28_4_ = 0.5;
      auVar30._32_4_ = 0.5;
      auVar30._36_4_ = 0.5;
      auVar30._40_4_ = 0.5;
      auVar30._44_4_ = 0.5;
      auVar30._48_4_ = 0.5;
      auVar30._52_4_ = 0.5;
      auVar30._56_4_ = 0.5;
      auVar30._60_4_ = 0.5;
      auVar79 = vfmadd213ps_avx512f(auVar77,auVar79,auVar30);
      local_23c0 = auVar79._0_8_;
      local_1340 = local_23c0;
      uStack_23b8 = auVar79._8_8_;
      uStack_1338 = uStack_23b8;
      uStack_23b0 = auVar79._16_8_;
      uStack_1330 = uStack_23b0;
      uStack_23a8 = auVar79._24_8_;
      uStack_1328 = uStack_23a8;
      uStack_23a0 = auVar79._32_8_;
      uStack_1320 = uStack_23a0;
      uStack_2398 = auVar79._40_8_;
      uStack_1318 = uStack_2398;
      uStack_2390 = auVar79._48_8_;
      uStack_1310 = uStack_2390;
      uStack_2388 = auVar79._56_8_;
      uStack_1308 = uStack_2388;
      local_2280 = auVar78._0_8_;
      local_1380 = local_2280;
      uStack_2278 = auVar78._8_8_;
      uStack_1378 = uStack_2278;
      uStack_2270 = auVar78._16_8_;
      uStack_1370 = uStack_2270;
      uStack_2268 = auVar78._24_8_;
      uStack_1368 = uStack_2268;
      uStack_2260 = auVar78._32_8_;
      uStack_1360 = uStack_2260;
      uStack_2258 = auVar78._40_8_;
      uStack_1358 = uStack_2258;
      uStack_2250 = auVar78._48_8_;
      uStack_1350 = uStack_2250;
      uStack_2248 = auVar78._56_8_;
      uStack_1348 = uStack_2248;
      local_13c0 = local_2240;
      uStack_13b8 = uStack_2238;
      uStack_13b0 = uStack_2230;
      uStack_13a8 = uStack_2228;
      uStack_13a0 = uStack_2220;
      uStack_1398 = uStack_2218;
      uStack_1390 = uStack_2210;
      uStack_1388 = uStack_2208;
      auVar77 = vfmadd213ps_avx512f(auVar78,auVar79,auVar77);
      auVar78._8_4_ = 1.0;
      auVar78._12_4_ = 1.0;
      auVar78._0_4_ = 1.0;
      auVar78._4_4_ = 1.0;
      auVar78._16_4_ = 1.0;
      auVar78._20_4_ = 1.0;
      auVar78._24_4_ = 1.0;
      auVar78._28_4_ = 1.0;
      auVar78._32_4_ = 1.0;
      auVar78._36_4_ = 1.0;
      auVar78._40_4_ = 1.0;
      auVar78._44_4_ = 1.0;
      auVar78._48_4_ = 1.0;
      auVar78._52_4_ = 1.0;
      auVar78._56_4_ = 1.0;
      auVar78._60_4_ = 1.0;
      auVar78 = vaddps_avx512f(auVar77,auVar78);
      local_b80 = local_22c0._0_8_;
      uStack_b78 = local_22c0._8_8_;
      uStack_b70 = uStack_22b0;
      uStack_b68 = uStack_22a8;
      uStack_b60 = uStack_22a0;
      uStack_b58 = uStack_2298;
      uStack_b50 = uStack_2290;
      uStack_b48 = uStack_2288;
      auVar43._16_8_ = uStack_22b0;
      auVar43._0_16_ = local_22c0;
      auVar43._24_8_ = uStack_22a8;
      auVar43._32_8_ = uStack_22a0;
      auVar43._40_8_ = uStack_2298;
      auVar43._48_8_ = uStack_2290;
      auVar43._56_8_ = uStack_2288;
      local_a00 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(local_a00);
      auVar77 = vcvttps2dq_avx512f(auVar43);
      auVar77 = vmovdqa64_avx512f(auVar77);
      auVar77 = vmovdqa64_avx512f(auVar77);
      auVar79 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_b00 = vmovdqa64_avx512f(auVar77);
      local_b40 = vmovdqa64_avx512f(auVar79);
      auVar77 = vmovdqa64_avx512f(local_b00);
      auVar79 = vmovdqa64_avx512f(local_b40);
      auVar77 = vpaddd_avx512f(auVar77,auVar79);
      auVar77 = vmovdqa64_avx512f(auVar77);
      auVar77 = vmovdqa64_avx512f(auVar77);
      local_a80 = vmovdqa64_avx512f(auVar77);
      local_a84 = 0x17;
      auVar77 = vmovdqa64_avx512f(local_a80);
      auVar77 = vpslld_avx512f(auVar77,ZEXT416(0x17));
      auVar77 = vmovdqa64_avx512f(auVar77);
      auVar77 = vmovdqa64_avx512f(auVar77);
      local_a40 = vmovdqa64_avx512f(auVar77);
      auVar77 = vmovdqa64_avx512f(local_a40);
      local_23c0 = auVar78._0_8_;
      local_1740 = local_23c0;
      uStack_23b8 = auVar78._8_8_;
      uStack_1738 = uStack_23b8;
      uStack_23b0 = auVar78._16_8_;
      uStack_1730 = uStack_23b0;
      uStack_23a8 = auVar78._24_8_;
      uStack_1728 = uStack_23a8;
      uStack_23a0 = auVar78._32_8_;
      uStack_1720 = uStack_23a0;
      uStack_2398 = auVar78._40_8_;
      uStack_1718 = uStack_2398;
      uStack_2390 = auVar78._48_8_;
      uStack_1710 = uStack_2390;
      uStack_2388 = auVar78._56_8_;
      uStack_1708 = uStack_2388;
      local_2400 = auVar77._0_8_;
      local_1780 = local_2400;
      uStack_23f8 = auVar77._8_8_;
      uStack_1778 = uStack_23f8;
      uStack_23f0 = auVar77._16_8_;
      uStack_1770 = uStack_23f0;
      uStack_23e8 = auVar77._24_8_;
      uStack_1768 = uStack_23e8;
      uStack_23e0 = auVar77._32_8_;
      uStack_1760 = uStack_23e0;
      uStack_23d8 = auVar77._40_8_;
      uStack_1758 = uStack_23d8;
      uStack_23d0 = auVar77._48_8_;
      uStack_1750 = uStack_23d0;
      uStack_23c8 = auVar77._56_8_;
      uStack_1748 = uStack_23c8;
      auVar77 = vmulps_avx512f(auVar78,auVar77);
      local_23c0 = auVar77._0_8_;
      uStack_23b8 = auVar77._8_8_;
      uStack_23b0 = auVar77._16_8_;
      uStack_23a8 = auVar77._24_8_;
      uStack_23a0 = auVar77._32_8_;
      uStack_2398 = auVar77._40_8_;
      uStack_2390 = auVar77._48_8_;
      uStack_2388 = auVar77._56_8_;
      *(undefined1 (*) [8])*local_2830 = local_23c0;
      *(undefined8 *)(*local_2830 + 8) = uStack_23b8;
      *(undefined8 *)(*local_2830 + 0x10) = uStack_23b0;
      *(undefined8 *)(*local_2830 + 0x18) = uStack_23a8;
      *(undefined8 *)(*local_2830 + 0x20) = uStack_23a0;
      *(undefined8 *)(*local_2830 + 0x28) = uStack_2398;
      *(undefined8 *)(*local_2830 + 0x30) = uStack_2390;
      *(undefined8 *)(*local_2830 + 0x38) = uStack_2388;
      auVar77 = vaddps_avx512f(auVar70,auVar77);
      *local_2840 = auVar77;
      local_2830 = local_2830 + 1;
      local_2838 = local_2838 + 1;
      local_2840 = local_2840 + 1;
      local_16c0 = local_1700;
      uStack_16b8 = uStack_16f8;
      uStack_16b0 = uStack_16f0;
      uStack_16a8 = uStack_16e8;
      uStack_16a0 = uStack_16e0;
      uStack_1698 = uStack_16d8;
      uStack_1690 = uStack_16d0;
      uStack_1688 = uStack_16c8;
      local_dc0 = local_e40;
      uStack_db8 = uStack_e38;
      uStack_db0 = uStack_e30;
      uStack_da8 = uStack_e28;
      uStack_da0 = uStack_e20;
      uStack_d98 = uStack_e18;
      uStack_d90 = uStack_e10;
      uStack_d88 = uStack_e08;
    }
    for (; local_2844 + 7 < in_ECX; local_2844 = local_2844 + 8) {
      auVar69 = *(undefined1 (*) [12])*local_2840;
      fStack_2994 = (float)((ulong)*(undefined8 *)(*local_2840 + 8) >> 0x20);
      fStack_2990 = (float)*(undefined8 *)(*local_2840 + 0x10);
      fStack_298c = (float)((ulong)*(undefined8 *)(*local_2840 + 0x10) >> 0x20);
      fStack_2988 = (float)*(undefined8 *)(*local_2840 + 0x18);
      fStack_2984 = (float)((ulong)*(undefined8 *)(*local_2840 + 0x18) >> 0x20);
      auVar19 = vsubps_avx(*(undefined1 (*) [32])*local_2830,*(undefined1 (*) [32])*local_2838);
      local_2960 = auVar19._0_8_;
      uStack_2958 = auVar19._8_8_;
      uStack_2950 = auVar19._16_8_;
      uStack_2948 = auVar19._24_8_;
      local_9c0 = 0;
      uStack_9b8 = 0;
      uStack_9b0 = 0;
      uStack_9a8 = 0;
      local_1d40 = 0x3f800000;
      uStack_1d3c = 0x3f800000;
      uStack_1d38 = 0x3f800000;
      uStack_1d34 = 0x3f800000;
      uStack_1d30 = 0x3f800000;
      uStack_1d2c = 0x3f800000;
      uStack_1d28 = 0x3f800000;
      uStack_1d24 = 0x3f800000;
      local_980 = local_2960;
      uStack_978 = uStack_2958;
      uStack_970 = uStack_2950;
      uStack_968 = uStack_2948;
      local_9a0 = 0x42b0c0a5;
      uStack_99c = 0x42b0c0a5;
      uStack_998 = 0x42b0c0a5;
      uStack_994 = 0x42b0c0a5;
      uStack_990 = 0x42b0c0a5;
      uStack_98c = 0x42b0c0a5;
      uStack_988 = 0x42b0c0a5;
      uStack_984 = 0x42b0c0a5;
      auVar44._8_4_ = 0x42b0c0a5;
      auVar44._0_8_ = 0x42b0c0a542b0c0a5;
      auVar44._12_4_ = 0x42b0c0a5;
      auVar44._16_4_ = 0x42b0c0a5;
      auVar44._20_4_ = 0x42b0c0a5;
      auVar44._24_4_ = 0x42b0c0a5;
      auVar44._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(auVar19,auVar44);
      local_1cc0._0_8_ = auVar19._0_8_;
      local_1c80 = local_1cc0._0_8_;
      local_1cc0._8_8_ = auVar19._8_8_;
      uStack_1c78 = local_1cc0._8_8_;
      local_1cc0._16_8_ = auVar19._16_8_;
      uStack_1c70 = local_1cc0._16_8_;
      local_1cc0._24_8_ = auVar19._24_8_;
      uStack_1c68 = local_1cc0._24_8_;
      local_1ca0 = 0xc2b0c0a5;
      uStack_1c9c = 0xc2b0c0a5;
      uStack_1c98 = 0xc2b0c0a5;
      uStack_1c94 = 0xc2b0c0a5;
      uStack_1c90 = 0xc2b0c0a5;
      uStack_1c8c = 0xc2b0c0a5;
      uStack_1c88 = 0xc2b0c0a5;
      uStack_1c84 = 0xc2b0c0a5;
      auVar20._8_4_ = 0xc2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._12_4_ = 0xc2b0c0a5;
      auVar20._16_4_ = 0xc2b0c0a5;
      auVar20._20_4_ = 0xc2b0c0a5;
      auVar20._24_4_ = 0xc2b0c0a5;
      auVar20._28_4_ = 0xc2b0c0a5;
      auVar20 = vmaxps_avx(auVar19,auVar20);
      local_948 = local_1cc0;
      local_8b0 = ::_ps256_cephes_LOG2EF;
      local_8b8 = ::_ps256_0p5;
      local_1cc0._0_8_ = auVar20._0_8_;
      local_720 = local_1cc0._0_8_;
      local_1cc0._8_8_ = auVar20._8_8_;
      uStack_718 = local_1cc0._8_8_;
      local_1cc0._16_8_ = auVar20._16_8_;
      uStack_710 = local_1cc0._16_8_;
      local_1cc0._24_8_ = auVar20._24_8_;
      uStack_708 = local_1cc0._24_8_;
      local_740[0] = 1.442695;
      local_740[1] = 1.442695;
      afStack_738[0] = 1.442695;
      afStack_738[1] = 1.442695;
      afStack_730[0] = 1.442695;
      afStack_730[1] = 1.442695;
      afStack_728[0] = 1.442695;
      afStack_728[1] = 1.442695;
      local_760[0] = 0.5;
      local_760[1] = 0.5;
      afStack_758[0] = 0.5;
      afStack_758[1] = 0.5;
      afStack_750[0] = 0.5;
      afStack_750[1] = 0.5;
      afStack_748[0] = 0.5;
      afStack_748[1] = 0.5;
      auVar46._8_4_ = 1.442695;
      auVar46._12_4_ = 1.442695;
      auVar46._0_4_ = 1.442695;
      auVar46._4_4_ = 1.442695;
      auVar46._16_4_ = 1.442695;
      auVar46._20_4_ = 1.442695;
      auVar46._24_4_ = 1.442695;
      auVar46._28_4_ = 1.442695;
      auVar45._8_4_ = 0.5;
      auVar45._12_4_ = 0.5;
      auVar45._0_4_ = 0.5;
      auVar45._4_4_ = 0.5;
      auVar45._16_4_ = 0.5;
      auVar45._20_4_ = 0.5;
      auVar45._24_4_ = 0.5;
      auVar45._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar46,auVar20,auVar45);
      auVar21 = vroundps_avx(ZEXT1632(auVar17),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar17),auVar21,1);
      local_1d60._0_8_ = auVar19._0_8_;
      local_880 = local_1d60._0_8_;
      local_1d60._8_8_ = auVar19._8_8_;
      uStack_878 = local_1d60._8_8_;
      local_1d60._16_8_ = auVar19._16_8_;
      uStack_870 = local_1d60._16_8_;
      local_1d60._24_8_ = auVar19._24_8_;
      uStack_868 = local_1d60._24_8_;
      local_8a0 = 0x3f8000003f800000;
      uStack_898 = 0x3f8000003f800000;
      uStack_890 = 0x3f8000003f800000;
      uStack_888 = 0x3f8000003f800000;
      auVar80._8_8_ = 0x3f8000003f800000;
      auVar80._0_8_ = 0x3f8000003f800000;
      auVar80._16_8_ = 0x3f8000003f800000;
      auVar80._24_8_ = 0x3f8000003f800000;
      local_1d60 = vpand_avx2(auVar19,auVar80);
      local_1ce0 = auVar21._0_8_;
      local_1c40 = local_1ce0;
      uStack_1cd8 = auVar21._8_8_;
      uStack_1c38 = uStack_1cd8;
      uStack_1cd0 = auVar21._16_8_;
      uStack_1c30 = uStack_1cd0;
      uStack_1cc8 = auVar21._24_8_;
      uStack_1c28 = uStack_1cc8;
      local_1c60 = local_1d60._0_8_;
      uStack_1c58 = local_1d60._8_8_;
      uStack_1c50 = local_1d60._16_8_;
      uStack_1c48 = local_1d60._24_8_;
      local_1d00 = vsubps_avx(auVar21,local_1d60);
      local_840 = local_1d00;
      local_830 = ::_ps256_cephes_exp_C1;
      local_480 = local_1d00._0_8_;
      uStack_478 = local_1d00._8_8_;
      uStack_470 = local_1d00._16_8_;
      uStack_468 = local_1d00._24_8_;
      local_4a0[0] = 0.6933594;
      local_4a0[1] = 0.6933594;
      afStack_498[0] = 0.6933594;
      afStack_498[1] = 0.6933594;
      afStack_490[0] = 0.6933594;
      afStack_490[1] = 0.6933594;
      afStack_488[0] = 0.6933594;
      afStack_488[1] = 0.6933594;
      local_4c0 = local_1cc0._0_8_;
      uStack_4b8 = local_1cc0._8_8_;
      uStack_4b0 = local_1cc0._16_8_;
      uStack_4a8 = local_1cc0._24_8_;
      auVar52._8_4_ = 0.6933594;
      auVar52._12_4_ = 0.6933594;
      auVar52._0_4_ = 0.6933594;
      auVar52._4_4_ = 0.6933594;
      auVar52._16_4_ = 0.6933594;
      auVar52._20_4_ = 0.6933594;
      auVar52._24_4_ = 0.6933594;
      auVar52._28_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar52,local_1d00,auVar20);
      local_848 = ::_ps256_cephes_exp_C2;
      local_420 = local_1d00._0_8_;
      uStack_418 = local_1d00._8_8_;
      uStack_410 = local_1d00._16_8_;
      uStack_408 = local_1d00._24_8_;
      local_440[0] = -0.00021219444;
      local_440[1] = -0.00021219444;
      afStack_438[0] = -0.00021219444;
      afStack_438[1] = -0.00021219444;
      afStack_430[0] = -0.00021219444;
      afStack_430[1] = -0.00021219444;
      afStack_428[0] = -0.00021219444;
      afStack_428[1] = -0.00021219444;
      local_1cc0._0_8_ = auVar17._0_8_;
      local_460 = local_1cc0._0_8_;
      local_1cc0._8_8_ = auVar17._8_8_;
      uStack_458 = local_1cc0._8_8_;
      uStack_450 = 0;
      uStack_448 = 0;
      auVar53._8_4_ = -0.00021219444;
      auVar53._12_4_ = -0.00021219444;
      auVar53._0_4_ = -0.00021219444;
      auVar53._4_4_ = -0.00021219444;
      auVar53._16_4_ = -0.00021219444;
      auVar53._20_4_ = -0.00021219444;
      auVar53._24_4_ = -0.00021219444;
      auVar53._28_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar53,local_1d00,ZEXT1632(auVar17));
      auVar80 = ZEXT1632(auVar17);
      local_1cc0._0_8_ = auVar17._0_8_;
      local_15c0 = local_1cc0._0_8_;
      local_1cc0._8_8_ = auVar17._8_8_;
      uStack_15b8 = local_1cc0._8_8_;
      uStack_15b0 = 0;
      uStack_15a8 = 0;
      local_15a0._0_4_ = auVar17._0_4_;
      local_15a0._4_4_ = auVar17._4_4_;
      uStack_1598._0_4_ = auVar17._8_4_;
      uStack_1598._4_4_ = auVar17._12_4_;
      local_1ce0._4_4_ = local_15a0._4_4_ * local_15a0._4_4_;
      local_1ce0._0_4_ = (float)local_15a0 * (float)local_15a0;
      local_500 = local_1ce0;
      uStack_1cd8._0_4_ = (float)uStack_1598 * (float)uStack_1598;
      uStack_1cd8._4_4_ = uStack_1598._4_4_ * uStack_1598._4_4_;
      auVar16 = _local_1ce0;
      _local_1ce0 = ZEXT1632(_local_1ce0);
      auVar44 = _local_1ce0;
      uStack_1d78._0_4_ = 0x39506967;
      local_1d80 = (undefined1  [8])0x3950696739506967;
      uStack_1d78._4_4_ = 0x39506967;
      uStack_1d70._0_4_ = 0x39506967;
      uStack_1d70._4_4_ = 0x39506967;
      auVar71 = _local_1d80;
      uStack_1d68._0_4_ = 0x39506967;
      uStack_1d68._4_4_ = 0x39506967;
      auVar19 = _local_1d80;
      local_938 = local_1d80;
      local_8d0 = ::_ps256_cephes_exp_p1;
      local_6c0 = 0x3950696739506967;
      uStack_6b8 = uStack_1d78;
      uStack_1d70 = auVar71._16_8_;
      uStack_6b0 = uStack_1d70;
      uStack_1d68 = auVar19._24_8_;
      uStack_6a8 = uStack_1d68;
      local_6e0 = local_1cc0._0_8_;
      uStack_6d8 = local_1cc0._8_8_;
      uStack_6d0 = 0;
      uStack_6c8 = 0;
      local_700[0] = 0.0013981999;
      local_700[1] = 0.0013981999;
      afStack_6f8[0] = 0.0013981999;
      afStack_6f8[1] = 0.0013981999;
      afStack_6f0[0] = 0.0013981999;
      afStack_6f0[1] = 0.0013981999;
      afStack_6e8[0] = 0.0013981999;
      afStack_6e8[1] = 0.0013981999;
      auVar47._8_4_ = 0.0013981999;
      auVar47._12_4_ = 0.0013981999;
      auVar47._0_4_ = 0.0013981999;
      auVar47._4_4_ = 0.0013981999;
      auVar47._16_4_ = 0.0013981999;
      auVar47._20_4_ = 0.0013981999;
      auVar47._24_4_ = 0.0013981999;
      auVar47._28_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(auVar80,auVar19,auVar47);
      local_8e8 = ::_ps256_cephes_exp_p2;
      local_1d80 = auVar17._0_8_;
      local_660 = local_1d80;
      uStack_1d78 = auVar17._8_8_;
      uStack_658 = uStack_1d78;
      uStack_650 = 0;
      uStack_648 = 0;
      local_680 = local_1cc0._0_8_;
      uStack_678 = local_1cc0._8_8_;
      uStack_670 = 0;
      uStack_668 = 0;
      local_6a0[0] = 0.008333452;
      local_6a0[1] = 0.008333452;
      afStack_698[0] = 0.008333452;
      afStack_698[1] = 0.008333452;
      afStack_690[0] = 0.008333452;
      afStack_690[1] = 0.008333452;
      afStack_688[0] = 0.008333452;
      afStack_688[1] = 0.008333452;
      auVar48._8_4_ = 0.008333452;
      auVar48._12_4_ = 0.008333452;
      auVar48._0_4_ = 0.008333452;
      auVar48._4_4_ = 0.008333452;
      auVar48._16_4_ = 0.008333452;
      auVar48._20_4_ = 0.008333452;
      auVar48._24_4_ = 0.008333452;
      auVar48._28_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar17),auVar48);
      local_900 = ::_ps256_cephes_exp_p3;
      local_1d80 = auVar17._0_8_;
      local_600 = local_1d80;
      uStack_1d78 = auVar17._8_8_;
      uStack_5f8 = uStack_1d78;
      uStack_5f0 = 0;
      uStack_5e8 = 0;
      local_620 = local_1cc0._0_8_;
      uStack_618 = local_1cc0._8_8_;
      uStack_610 = 0;
      uStack_608 = 0;
      local_640[0] = 0.041665796;
      local_640[1] = 0.041665796;
      afStack_638[0] = 0.041665796;
      afStack_638[1] = 0.041665796;
      afStack_630[0] = 0.041665796;
      afStack_630[1] = 0.041665796;
      afStack_628[0] = 0.041665796;
      afStack_628[1] = 0.041665796;
      auVar49._8_4_ = 0.041665796;
      auVar49._12_4_ = 0.041665796;
      auVar49._0_4_ = 0.041665796;
      auVar49._4_4_ = 0.041665796;
      auVar49._16_4_ = 0.041665796;
      auVar49._20_4_ = 0.041665796;
      auVar49._24_4_ = 0.041665796;
      auVar49._28_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar17),auVar49);
      local_918 = ::_ps256_cephes_exp_p4;
      local_1d80 = auVar17._0_8_;
      local_5a0 = local_1d80;
      uStack_1d78 = auVar17._8_8_;
      uStack_598 = uStack_1d78;
      uStack_590 = 0;
      uStack_588 = 0;
      local_5c0 = local_1cc0._0_8_;
      uStack_5b8 = local_1cc0._8_8_;
      uStack_5b0 = 0;
      uStack_5a8 = 0;
      local_5e0[0] = 0.16666666;
      local_5e0[1] = 0.16666666;
      afStack_5d8[0] = 0.16666666;
      afStack_5d8[1] = 0.16666666;
      afStack_5d0[0] = 0.16666666;
      afStack_5d0[1] = 0.16666666;
      afStack_5c8[0] = 0.16666666;
      afStack_5c8[1] = 0.16666666;
      auVar50._8_4_ = 0.16666666;
      auVar50._12_4_ = 0.16666666;
      auVar50._0_4_ = 0.16666666;
      auVar50._4_4_ = 0.16666666;
      auVar50._16_4_ = 0.16666666;
      auVar50._20_4_ = 0.16666666;
      auVar50._24_4_ = 0.16666666;
      auVar50._28_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar17),auVar50);
      local_930 = ::_ps256_cephes_exp_p5;
      local_1d80 = auVar17._0_8_;
      local_540 = local_1d80;
      uStack_1d78 = auVar17._8_8_;
      uStack_538 = uStack_1d78;
      uStack_530 = 0;
      uStack_528 = 0;
      local_560 = local_1cc0._0_8_;
      uStack_558 = local_1cc0._8_8_;
      uStack_550 = 0;
      uStack_548 = 0;
      local_580[0] = 0.5;
      local_580[1] = 0.5;
      afStack_578[0] = 0.5;
      afStack_578[1] = 0.5;
      afStack_570[0] = 0.5;
      afStack_570[1] = 0.5;
      afStack_568[0] = 0.5;
      afStack_568[1] = 0.5;
      auVar51._8_4_ = 0.5;
      auVar51._12_4_ = 0.5;
      auVar51._0_4_ = 0.5;
      auVar51._4_4_ = 0.5;
      auVar51._16_4_ = 0.5;
      auVar51._20_4_ = 0.5;
      auVar51._24_4_ = 0.5;
      auVar51._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar17),auVar51);
      local_940 = local_1ce0;
      local_1d80 = auVar17._0_8_;
      local_4e0 = local_1d80;
      uStack_1d78 = auVar17._8_8_;
      uStack_4d8 = uStack_1d78;
      uStack_4d0 = 0;
      uStack_4c8 = 0;
      uStack_1cd8 = auVar16._8_8_;
      uStack_4f8 = uStack_1cd8;
      uStack_4f0 = 0;
      uStack_4e8 = 0;
      local_520 = local_1cc0._0_8_;
      uStack_518 = local_1cc0._8_8_;
      uStack_510 = 0;
      uStack_508 = 0;
      auVar17 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar17),auVar80);
      local_1d80 = auVar17._0_8_;
      uVar22 = local_1d80;
      uStack_1d78 = auVar17._8_8_;
      uVar23 = uStack_1d78;
      uStack_1ab0 = 0;
      uStack_1aa8 = 0;
      local_1ae0 = 0x3f8000003f800000;
      uStack_1ad8 = 0x3f8000003f800000;
      uStack_1ad0 = 0x3f8000003f800000;
      uStack_1ac8 = 0x3f8000003f800000;
      local_1ac0._0_4_ = auVar17._0_4_;
      local_1ac0._4_4_ = auVar17._4_4_;
      uStack_1ab8._0_4_ = auVar17._8_4_;
      uStack_1ab8._4_4_ = auVar17._12_4_;
      local_1d80._4_4_ = local_1ac0._4_4_ + 1.0;
      local_1d80._0_4_ = (float)local_1ac0 + 1.0;
      uStack_1d78._0_4_ = (float)uStack_1ab8 + 1.0;
      uStack_1d78._4_4_ = uStack_1ab8._4_4_ + 1.0;
      uStack_1d70._0_4_ = 0x3f800000;
      uStack_1d70._4_4_ = 0x3f800000;
      auVar71 = _local_1d80;
      uStack_1d68._0_4_ = 0x3f800000;
      uStack_1d68._4_4_ = 0x3f800000;
      auVar20 = _local_1d80;
      local_820._0_4_ = local_1d00._0_4_;
      local_820._4_4_ = local_1d00._4_4_;
      uStack_818._0_4_ = local_1d00._8_4_;
      uStack_818._4_4_ = local_1d00._12_4_;
      uStack_810._0_4_ = local_1d00._16_4_;
      uStack_810._4_4_ = local_1d00._20_4_;
      uStack_808._0_4_ = local_1d00._24_4_;
      uStack_808._4_4_ = local_1d00._28_4_;
      local_1d20._4_4_ = (int)local_820._4_4_;
      local_1d20._0_4_ = (int)(float)local_820;
      local_1d20._8_4_ = (int)(float)uStack_818;
      local_1d20._12_4_ = (int)uStack_818._4_4_;
      local_1d20._16_4_ = (int)(float)uStack_810;
      local_1d20._20_4_ = (int)uStack_810._4_4_;
      auVar75 = local_1d20._0_24_;
      local_1d20._24_4_ = (int)(float)uStack_808;
      local_1d20._28_4_ = (int)uStack_808._4_4_;
      auVar19 = local_1d20;
      local_7e0 = local_1d20._0_8_;
      uStack_7d8 = local_1d20._8_8_;
      local_1d20._16_8_ = auVar75._16_8_;
      uStack_7d0 = local_1d20._16_8_;
      local_1d20._24_8_ = auVar19._24_8_;
      uStack_7c8 = local_1d20._24_8_;
      local_800 = 0x7f0000007f;
      uStack_7f8 = 0x7f0000007f;
      uStack_7f0 = 0x7f0000007f;
      uStack_7e8 = 0x7f0000007f;
      local_3e0 = local_1d20._0_8_;
      uStack_3d8 = local_1d20._8_8_;
      uStack_3d0 = local_1d20._16_8_;
      uStack_3c8 = local_1d20._24_8_;
      local_400 = 0x7f0000007f;
      uStack_3f8 = 0x7f0000007f;
      uStack_3f0 = 0x7f0000007f;
      uStack_3e8 = 0x7f0000007f;
      auVar55._16_8_ = local_1d20._16_8_;
      auVar55._0_16_ = local_1d20._0_16_;
      auVar55._24_8_ = local_1d20._24_8_;
      auVar54._8_8_ = 0x7f0000007f;
      auVar54._0_8_ = 0x7f0000007f;
      auVar54._16_8_ = 0x7f0000007f;
      auVar54._24_8_ = 0x7f0000007f;
      auVar19 = vpaddd_avx2(auVar55,auVar54);
      local_1d20._0_8_ = auVar19._0_8_;
      local_7a0 = local_1d20._0_8_;
      local_1d20._8_8_ = auVar19._8_8_;
      uStack_798 = local_1d20._8_8_;
      local_1d20._16_8_ = auVar19._16_8_;
      uStack_790 = local_1d20._16_8_;
      local_1d20._24_8_ = auVar19._24_8_;
      uStack_788 = local_1d20._24_8_;
      local_7a4 = 0x17;
      local_3a0 = local_1d20._0_8_;
      uStack_398 = local_1d20._8_8_;
      uStack_390 = local_1d20._16_8_;
      uStack_388 = local_1d20._24_8_;
      local_3a4 = 0x17;
      local_1d20 = vpslld_avx2(auVar19,ZEXT416(0x17));
      local_780 = local_1d20._0_8_;
      uStack_778 = local_1d20._8_8_;
      uStack_770 = local_1d20._16_8_;
      uStack_768 = local_1d20._24_8_;
      local_15e0 = local_1d80;
      uStack_15d8 = uStack_1d78;
      uStack_1d70 = auVar71._16_8_;
      uStack_15d0 = uStack_1d70;
      uStack_1d68 = auVar20._24_8_;
      uStack_15c8 = uStack_1d68;
      local_1600._0_4_ = local_1d20._0_4_;
      local_1600._4_4_ = local_1d20._4_4_;
      uStack_15f8._0_4_ = local_1d20._8_4_;
      uStack_15f8._4_4_ = local_1d20._12_4_;
      uStack_15f0._0_4_ = local_1d20._16_4_;
      uStack_15f0._4_4_ = local_1d20._20_4_;
      uStack_15e8._0_4_ = local_1d20._24_4_;
      local_1d80._0_4_ = ((float)local_1ac0 + 1.0) * (float)local_1600;
      local_1d80._4_4_ = (local_1ac0._4_4_ + 1.0) * local_1600._4_4_;
      uStack_15f8._0_4_ = ((float)uStack_1ab8 + 1.0) * (float)uStack_15f8;
      uStack_15f8._4_4_ = (uStack_1ab8._4_4_ + 1.0) * uStack_15f8._4_4_;
      uStack_1d78._0_4_ = (float)uStack_15f8;
      uStack_1d78._4_4_ = uStack_15f8._4_4_;
      uStack_1d70._0_4_ = (float)uStack_15f0 * 1.0;
      uStack_1d70._4_4_ = uStack_15f0._4_4_ * 1.0;
      auVar71 = _local_1d80;
      uStack_1d68._0_4_ = (float)uStack_15e8 * 1.0;
      uStack_1d68._4_4_ = 0x3f800000;
      auVar20 = _local_1d80;
      uStack_1d70 = auVar71._16_8_;
      uStack_1d68 = auVar20._24_8_;
      local_1b28 = local_2830;
      local_1b60 = local_1d80;
      uStack_1b58 = uStack_1d78;
      uStack_1b50 = uStack_1d70;
      uStack_1b48 = uStack_1d68;
      *(undefined1 (*) [8])*local_2830 = local_1d80;
      *(undefined8 *)(*local_2830 + 8) = uStack_1d78;
      *(undefined8 *)(*local_2830 + 0x10) = uStack_1d70;
      *(undefined8 *)(*local_2830 + 0x18) = uStack_1d68;
      auVar19._12_4_ = fStack_2994;
      auVar19._0_12_ = auVar69;
      auVar19._16_4_ = fStack_2990;
      auVar19._20_4_ = fStack_298c;
      auVar19._24_4_ = fStack_2988;
      auVar19._28_4_ = fStack_2984;
      local_1aa0 = local_1d80;
      uStack_1a98 = uStack_1d78;
      uStack_1a90 = uStack_1d70;
      uStack_1a88 = uStack_1d68;
      local_1a80._0_4_ = auVar69._0_4_;
      local_1a80._4_4_ = auVar69._4_4_;
      fStack_1a78 = auVar69._8_4_;
      local_1b68 = local_2840;
      local_1ba0 = CONCAT44((float)local_1a80._4_4_ + (float)local_1d80._4_4_,
                            (float)local_1a80._0_4_ + (float)local_1d80._0_4_);
      uStack_1b98 = CONCAT44(fStack_2994 + uStack_15f8._4_4_,fStack_1a78 + (float)uStack_15f8);
      uStack_1b90 = CONCAT44(fStack_298c + uStack_15f0._4_4_ * 1.0,
                             fStack_2990 + (float)uStack_15f0 * 1.0);
      uStack_1b88 = CONCAT44(fStack_2984 + 1.0,fStack_2988 + (float)uStack_15e8 * 1.0);
      auVar21._8_8_ = uStack_1b98;
      auVar21._0_8_ = local_1ba0;
      auVar21._16_8_ = uStack_1b90;
      auVar21._24_8_ = uStack_1b88;
      *(undefined1 (*) [32])*local_2840 = auVar21;
      local_2830 = (undefined1 (*) [64])(*local_2830 + 0x20);
      local_2838 = (undefined1 (*) [64])(*local_2838 + 0x20);
      local_2840 = (undefined1 (*) [64])(*local_2840 + 0x20);
      _local_1d80 = auVar20;
      _local_1ce0 = auVar44;
      local_1cc0 = auVar80;
      local_1ac0 = uVar22;
      uStack_1ab8 = uVar23;
      _local_1a80 = auVar19;
      local_1600 = local_1d20._0_8_;
      uStack_15f8 = local_1d20._8_8_;
      uStack_15f0 = local_1d20._16_8_;
      uStack_15e8 = local_1d20._24_8_;
      local_15a0 = local_15c0;
      uStack_1598 = uStack_15b8;
      uStack_1590 = uStack_15b0;
      uStack_1588 = uStack_15a8;
      local_928 = local_948;
      local_920 = local_938;
      local_910 = local_948;
      local_908 = local_938;
      local_8f8 = local_948;
      local_8f0 = local_938;
      local_8e0 = local_948;
      local_8d8 = local_938;
      local_8c8 = local_948;
      local_8c0 = local_938;
      local_8a8 = local_948;
      local_850 = local_948;
      local_838 = local_948;
      local_828 = local_840;
      local_820 = local_1d00._0_8_;
      uStack_818 = local_1d00._8_8_;
      uStack_810 = local_1d00._16_8_;
      uStack_808 = local_1d00._24_8_;
    }
    for (; local_2844 + 3 < in_ECX; local_2844 = local_2844 + 4) {
      local_1a50 = *(undefined8 *)*local_2830;
      uStack_1a48 = *(undefined8 *)(*local_2830 + 8);
      local_1a60 = *(undefined8 *)*local_2838;
      uStack_1a58 = *(undefined8 *)(*local_2838 + 8);
      auVar69 = *(undefined1 (*) [12])*local_2840;
      fStack_29c4 = (float)((ulong)*(undefined8 *)(*local_2840 + 8) >> 0x20);
      auVar17 = vsubps_avx(*(undefined1 (*) [16])*local_2830,*(undefined1 (*) [16])*local_2838);
      local_29b0 = auVar17._0_8_;
      uStack_29a8 = auVar17._8_8_;
      local_380 = (undefined1  [16])0x0;
      local_1a10 = 0x3f800000;
      uStack_1a0c = 0x3f800000;
      uStack_1a08 = 0x3f800000;
      uStack_1a04 = 0x3f800000;
      local_360 = local_29b0;
      uStack_358 = uStack_29a8;
      local_370 = 0x42b0c0a5;
      uStack_36c = 0x42b0c0a5;
      uStack_368 = 0x42b0c0a5;
      uStack_364 = 0x42b0c0a5;
      auVar56._8_4_ = 0x42b0c0a5;
      auVar56._0_8_ = 0x42b0c0a542b0c0a5;
      auVar56._12_4_ = 0x42b0c0a5;
      auVar17 = vminps_avx(auVar17,auVar56);
      local_19d0._0_8_ = auVar17._0_8_;
      local_19b0 = local_19d0._0_8_;
      local_19d0._8_8_ = auVar17._8_8_;
      uStack_19a8 = local_19d0._8_8_;
      local_19c0 = 0xc2b0c0a5;
      uStack_19bc = 0xc2b0c0a5;
      uStack_19b8 = 0xc2b0c0a5;
      uStack_19b4 = 0xc2b0c0a5;
      auVar16._8_4_ = 0xc2b0c0a5;
      auVar16._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar16._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar17,auVar16);
      local_19d0._0_8_ = auVar18._0_8_;
      uVar22 = local_19d0._0_8_;
      local_19d0._8_8_ = auVar18._8_8_;
      uVar23 = local_19d0._8_8_;
      local_1500 = 0x3fb8aa3b;
      uStack_14fc = 0x3fb8aa3b;
      uStack_14f8 = 0x3fb8aa3b;
      uStack_14f4 = 0x3fb8aa3b;
      local_14f0._0_4_ = auVar18._0_4_;
      local_14f0._4_4_ = auVar18._4_4_;
      uStack_14e8._0_4_ = auVar18._8_4_;
      uStack_14e8._4_4_ = auVar18._12_4_;
      local_19f0._4_4_ = local_14f0._4_4_ * 1.442695;
      local_19f0._0_4_ = (float)local_14f0 * 1.442695;
      uStack_19e8._0_4_ = (float)uStack_14e8 * 1.442695;
      uStack_19e8._4_4_ = uStack_14e8._4_4_ * 1.442695;
      local_18b0 = local_19f0;
      uStack_18a8 = uStack_19e8;
      local_18c0 = 0x3f000000;
      uStack_18bc = 0x3f000000;
      uStack_18b8 = 0x3f000000;
      uStack_18b4 = 0x3f000000;
      local_19f0._0_4_ = (float)local_14f0 * 1.442695 + 0.5;
      local_19f0._4_4_ = local_14f0._4_4_ * 1.442695 + 0.5;
      fVar81 = (float)uStack_14e8 * 1.442695 + 0.5;
      fVar82 = uStack_14e8._4_4_ * 1.442695 + 0.5;
      uStack_19e8._0_4_ = fVar81;
      uStack_19e8._4_4_ = fVar82;
      local_340 = local_19f0;
      uStack_338 = uStack_19e8;
      local_1a00._4_4_ = (int)(float)local_19f0._4_4_;
      local_1a00._0_4_ = (int)(float)local_19f0._0_4_;
      local_1a00._8_4_ = (int)fVar81;
      local_1a00._12_4_ = (int)fVar82;
      local_330 = local_1a00._0_8_;
      uStack_328 = local_1a00._8_8_;
      auVar57._8_8_ = local_1a00._8_8_;
      auVar57._0_8_ = local_1a00._0_8_;
      auVar16 = vcvtdq2ps_avx(auVar57);
      local_19e0 = auVar16._0_8_;
      local_310 = local_19e0;
      uStack_19d8 = auVar16._8_8_;
      uStack_308 = uStack_19d8;
      local_320 = local_19f0;
      uStack_318 = uStack_19e8;
      auVar58._8_8_ = uStack_19e8;
      auVar58._0_8_ = local_19f0;
      auVar17 = vcmpps_avx(auVar58,auVar16,1);
      local_1a20._0_8_ = auVar17._0_8_;
      local_2f0 = local_1a20._0_8_;
      local_1a20._8_8_ = auVar17._8_8_;
      uStack_2e8 = local_1a20._8_8_;
      local_300 = 0x3f8000003f800000;
      uStack_2f8 = 0x3f8000003f800000;
      auVar59._8_8_ = 0x3f8000003f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      local_1a20 = vpand_avx(auVar17,auVar59);
      local_1990 = local_19e0;
      uStack_1988 = uStack_19d8;
      local_19a0 = local_1a20._0_8_;
      uStack_1998 = local_1a20._8_8_;
      _local_19f0 = vsubps_avx(auVar16,local_1a20);
      local_2d0 = local_19f0;
      local_2c0 = ::_ps_cephes_exp_C1;
      local_2e0 = local_19d0;
      local_1b0 = local_19f0;
      uStack_1a8 = uStack_19e8;
      local_1c0[0] = 0.6933594;
      local_1c0[1] = 0.6933594;
      afStack_1b8[0] = 0.6933594;
      afStack_1b8[1] = 0.6933594;
      local_1d0 = local_19d0._0_8_;
      uStack_1c8 = local_19d0._8_8_;
      auVar62._8_4_ = 0.6933594;
      auVar62._12_4_ = 0.6933594;
      auVar62._0_4_ = 0.6933594;
      auVar62._4_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar62,_local_19f0,auVar18);
      local_2d8 = ::_ps_cephes_exp_C2;
      local_180 = local_19f0;
      uStack_178 = uStack_19e8;
      local_190[0] = -0.00021219444;
      local_190[1] = -0.00021219444;
      afStack_188[0] = -0.00021219444;
      afStack_188[1] = -0.00021219444;
      local_19d0._0_8_ = auVar17._0_8_;
      local_1a0 = local_19d0._0_8_;
      local_19d0._8_8_ = auVar17._8_8_;
      uStack_198 = local_19d0._8_8_;
      auVar63._8_4_ = -0.00021219444;
      auVar63._12_4_ = -0.00021219444;
      auVar63._0_4_ = -0.00021219444;
      auVar63._4_4_ = -0.00021219444;
      local_19d0 = vfnmadd213ps_fma(auVar63,_local_19f0,auVar17);
      local_1520 = local_19d0._0_8_;
      uStack_1518 = local_19d0._8_8_;
      local_1510._0_4_ = local_19d0._0_4_;
      local_1510._4_4_ = local_19d0._4_4_;
      uStack_1508._0_4_ = local_19d0._8_4_;
      uStack_1508._4_4_ = local_19d0._12_4_;
      local_19e0._4_4_ = local_1510._4_4_ * local_1510._4_4_;
      local_19e0._0_4_ = (float)local_1510 * (float)local_1510;
      uStack_19d8._0_4_ = (float)uStack_1508 * (float)uStack_1508;
      uStack_19d8._4_4_ = uStack_1508._4_4_ * uStack_1508._4_4_;
      uStack_1a28._0_4_ = 0x39506967;
      local_1a30 = (undefined1  [8])0x3950696739506967;
      uStack_1a28._4_4_ = 0x39506967;
      local_2a0 = local_1a30;
      local_238 = ::_ps_cephes_exp_p1;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_1a28;
      local_160 = local_19d0._0_8_;
      uStack_158 = local_19d0._8_8_;
      local_170[0] = 0.0013981999;
      local_170[1] = 0.0013981999;
      afStack_168[0] = 0.0013981999;
      afStack_168[1] = 0.0013981999;
      auVar64._8_4_ = 0.0013981999;
      auVar64._12_4_ = 0.0013981999;
      auVar64._0_4_ = 0.0013981999;
      auVar64._4_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(local_19d0,_local_1a30,auVar64);
      local_250 = ::_ps_cephes_exp_p2;
      local_1a30 = auVar17._0_8_;
      local_120 = local_1a30;
      uStack_1a28 = auVar17._8_8_;
      uStack_118 = uStack_1a28;
      local_130 = local_19d0._0_8_;
      uStack_128 = local_19d0._8_8_;
      local_140[0] = 0.008333452;
      local_140[1] = 0.008333452;
      afStack_138[0] = 0.008333452;
      afStack_138[1] = 0.008333452;
      auVar65._8_4_ = 0.008333452;
      auVar65._12_4_ = 0.008333452;
      auVar65._0_4_ = 0.008333452;
      auVar65._4_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(local_19d0,auVar17,auVar65);
      local_268 = ::_ps_cephes_exp_p3;
      local_1a30 = auVar17._0_8_;
      local_f0 = local_1a30;
      uStack_1a28 = auVar17._8_8_;
      uStack_e8 = uStack_1a28;
      local_100 = local_19d0._0_8_;
      uStack_f8 = local_19d0._8_8_;
      local_110[0] = 0.041665796;
      local_110[1] = 0.041665796;
      afStack_108[0] = 0.041665796;
      afStack_108[1] = 0.041665796;
      auVar66._8_4_ = 0.041665796;
      auVar66._12_4_ = 0.041665796;
      auVar66._0_4_ = 0.041665796;
      auVar66._4_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(local_19d0,auVar17,auVar66);
      local_280 = ::_ps_cephes_exp_p4;
      local_1a30 = auVar17._0_8_;
      local_c0 = local_1a30;
      uStack_1a28 = auVar17._8_8_;
      uStack_b8 = uStack_1a28;
      local_d0 = local_19d0._0_8_;
      uStack_c8 = local_19d0._8_8_;
      local_e0[0] = 0.16666666;
      local_e0[1] = 0.16666666;
      afStack_d8[0] = 0.16666666;
      afStack_d8[1] = 0.16666666;
      auVar67._8_4_ = 0.16666666;
      auVar67._12_4_ = 0.16666666;
      auVar67._0_4_ = 0.16666666;
      auVar67._4_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(local_19d0,auVar17,auVar67);
      local_298 = ::_ps_cephes_exp_p5;
      local_1a30 = auVar17._0_8_;
      local_90 = local_1a30;
      uStack_1a28 = auVar17._8_8_;
      uStack_88 = uStack_1a28;
      local_a0 = local_19d0._0_8_;
      uStack_98 = local_19d0._8_8_;
      local_b0[0] = 0.5;
      local_b0[1] = 0.5;
      afStack_a8[0] = 0.5;
      afStack_a8[1] = 0.5;
      auVar68._8_4_ = 0.5;
      auVar68._12_4_ = 0.5;
      auVar68._0_4_ = 0.5;
      auVar68._4_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(local_19d0,auVar17,auVar68);
      local_2a8 = local_19e0;
      local_1a30 = auVar17._0_8_;
      local_60 = local_1a30;
      uStack_1a28 = auVar17._8_8_;
      uStack_58 = uStack_1a28;
      local_70 = local_19e0;
      uStack_68 = uStack_19d8;
      local_80 = local_19d0._0_8_;
      uStack_78 = local_19d0._8_8_;
      auVar17 = vfmadd213ps_fma(_local_19e0,auVar17,local_19d0);
      local_1a30 = auVar17._0_8_;
      uVar24 = local_1a30;
      uStack_1a28 = auVar17._8_8_;
      uVar25 = uStack_1a28;
      local_18e0 = 0x3f8000003f800000;
      uStack_18d8 = 0x3f8000003f800000;
      local_18d0._0_4_ = auVar17._0_4_;
      local_18d0._4_4_ = auVar17._4_4_;
      uStack_18c8._0_4_ = auVar17._8_4_;
      uStack_18c8._4_4_ = auVar17._12_4_;
      local_1a30._4_4_ = local_18d0._4_4_ + 1.0;
      local_1a30._0_4_ = (float)local_18d0 + 1.0;
      uStack_1a28._0_4_ = (float)uStack_18c8 + 1.0;
      uStack_1a28._4_4_ = uStack_18c8._4_4_ + 1.0;
      local_350._0_4_ = local_19f0._0_4_;
      local_350._4_4_ = local_19f0._4_4_;
      uStack_348._0_4_ = local_19f0._8_4_;
      uStack_348._4_4_ = local_19f0._12_4_;
      local_1a00._4_4_ = (int)local_350._4_4_;
      local_1a00._0_4_ = (int)(float)local_350;
      local_1a00._8_4_ = (int)(float)uStack_348;
      local_1a00._12_4_ = (int)uStack_348._4_4_;
      local_210 = local_1a00._0_8_;
      uStack_208 = local_1a00._8_8_;
      local_220 = 0x7f0000007f;
      uStack_218 = 0x7f0000007f;
      auVar61._8_8_ = local_1a00._8_8_;
      auVar61._0_8_ = local_1a00._0_8_;
      auVar60._8_8_ = 0x7f0000007f;
      auVar60._0_8_ = 0x7f0000007f;
      auVar17 = vpaddd_avx(auVar61,auVar60);
      local_1a00._0_8_ = auVar17._0_8_;
      local_1f0 = local_1a00._0_8_;
      local_1a00._8_8_ = auVar17._8_8_;
      uStack_1e8 = local_1a00._8_8_;
      local_1f4 = 0x17;
      local_1a00 = vpslld_avx(auVar17,ZEXT416(0x17));
      local_1e0 = local_1a00._0_8_;
      uStack_1d8 = local_1a00._8_8_;
      local_1a40 = local_1a00._0_8_;
      uStack_1a38 = local_1a00._8_8_;
      local_1530 = local_1a30;
      uStack_1528 = uStack_1a28;
      local_1540._0_4_ = local_1a00._0_4_;
      local_1540._4_4_ = local_1a00._4_4_;
      uStack_1538._0_4_ = local_1a00._8_4_;
      uStack_1538._4_4_ = local_1a00._12_4_;
      local_1a30._0_4_ = ((float)local_18d0 + 1.0) * (float)local_1540;
      local_1a30._4_4_ = (local_18d0._4_4_ + 1.0) * local_1540._4_4_;
      uStack_1538._0_4_ = ((float)uStack_18c8 + 1.0) * (float)uStack_1538;
      uStack_1538._4_4_ = (uStack_18c8._4_4_ + 1.0) * uStack_1538._4_4_;
      uStack_1a28._0_4_ = (float)uStack_1538;
      uStack_1a28._4_4_ = uStack_1538._4_4_;
      local_1908 = local_2830;
      local_1920 = local_1a30;
      uStack_1918 = uStack_1a28;
      *(undefined1 (*) [8])*local_2830 = local_1a30;
      *(undefined8 *)(*local_2830 + 8) = uStack_1a28;
      auVar17._12_4_ = fStack_29c4;
      auVar17._0_12_ = auVar69;
      local_18a0 = local_1a30;
      uStack_1898 = uStack_1a28;
      local_1890._0_4_ = auVar69._0_4_;
      local_1890._4_4_ = auVar69._4_4_;
      fStack_1888 = auVar69._8_4_;
      local_1928 = local_2840;
      local_1940 = CONCAT44((float)local_1890._4_4_ + (float)local_1a30._4_4_,
                            (float)local_1890._0_4_ + (float)local_1a30._0_4_);
      uStack_1938 = CONCAT44(fStack_29c4 + uStack_1538._4_4_,fStack_1888 + (float)uStack_1538);
      auVar18._8_8_ = uStack_1938;
      auVar18._0_8_ = local_1940;
      *(undefined1 (*) [16])*local_2840 = auVar18;
      local_2830 = (undefined1 (*) [64])(*local_2830 + 0x10);
      local_2838 = (undefined1 (*) [64])(*local_2838 + 0x10);
      local_2840 = (undefined1 (*) [64])(*local_2840 + 0x10);
      local_18d0 = uVar24;
      uStack_18c8 = uVar25;
      _local_1890 = auVar17;
      local_1540 = local_1a00._0_8_;
      uStack_1538 = local_1a00._8_8_;
      local_1510 = local_1520;
      uStack_1508 = uStack_1518;
      local_14f0 = uVar22;
      uStack_14e8 = uVar23;
      local_350 = local_19f0;
      uStack_348 = uStack_19e8;
      local_2c8 = local_2e0;
      local_2b8 = local_2d0;
      local_2b0 = local_2e0;
      local_290 = local_2e0;
      local_288 = local_2a0;
      local_278 = local_2e0;
      local_270 = local_2a0;
      local_260 = local_2e0;
      local_258 = local_2a0;
      local_248 = local_2e0;
      local_240 = local_2a0;
      local_230 = local_2e0;
      local_228 = local_2a0;
    }
    for (; local_2844 < in_ECX; local_2844 = local_2844 + 1) {
      fVar81 = expf(*(float *)*local_2830 - *(float *)*local_2838);
      *(float *)*local_2830 = fVar81;
      *(float *)*local_2840 = fVar81 + *(float *)*local_2840;
      local_2830 = (undefined1 (*) [64])(*local_2830 + 4);
      local_2838 = (undefined1 (*) [64])(*local_2838 + 4);
      local_2840 = (undefined1 (*) [64])(*local_2840 + 4);
    }
  }
  local_29e4 = 0;
  auVar77 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
  local_29e0 = in_R9;
  for (; local_29e4 + 0xf < in_ECX; local_29e4 = local_29e4 + 0x10) {
    auVar78 = vdivps_avx512f(auVar77,*local_29e0);
    local_2a80 = auVar78._0_8_;
    uStack_2a78 = auVar78._8_8_;
    uStack_2a70 = auVar78._16_8_;
    uStack_2a68 = auVar78._24_8_;
    uStack_2a60 = auVar78._32_8_;
    uStack_2a58 = auVar78._40_8_;
    uStack_2a50 = auVar78._48_8_;
    uStack_2a48 = auVar78._56_8_;
    *(undefined8 *)*local_29e0 = local_2a80;
    *(undefined8 *)(*local_29e0 + 8) = uStack_2a78;
    *(undefined8 *)(*local_29e0 + 0x10) = uStack_2a70;
    *(undefined8 *)(*local_29e0 + 0x18) = uStack_2a68;
    *(undefined8 *)(*local_29e0 + 0x20) = uStack_2a60;
    *(undefined8 *)(*local_29e0 + 0x28) = uStack_2a58;
    *(undefined8 *)(*local_29e0 + 0x30) = uStack_2a50;
    *(undefined8 *)(*local_29e0 + 0x38) = uStack_2a48;
    local_29e0 = local_29e0 + 1;
  }
  auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
  auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
  uStack_14b0 = auVar17._0_8_;
  uStack_14a8 = auVar17._8_8_;
  for (; local_29e4 + 7 < in_ECX; local_29e4 = local_29e4 + 8) {
    auVar26._16_8_ = uStack_14b0;
    auVar26._0_16_ = auVar16;
    auVar26._24_8_ = uStack_14a8;
    auVar19 = vdivps_avx(auVar26,*(undefined1 (*) [32])*local_29e0);
    local_2ac0 = auVar19._0_8_;
    uStack_2ab8 = auVar19._8_8_;
    uStack_2ab0 = auVar19._16_8_;
    uStack_2aa8 = auVar19._24_8_;
    *(undefined8 *)*local_29e0 = local_2ac0;
    *(undefined8 *)(*local_29e0 + 8) = uStack_2ab8;
    *(undefined8 *)(*local_29e0 + 0x10) = uStack_2ab0;
    *(undefined8 *)(*local_29e0 + 0x18) = uStack_2aa8;
    local_29e0 = (undefined1 (*) [64])(*local_29e0 + 0x20);
  }
  auVar27._8_4_ = 0x3f800000;
  auVar27._0_8_ = 0x3f8000003f800000;
  auVar27._12_4_ = 0x3f800000;
  for (; local_29e4 + 3 < in_ECX; local_29e4 = local_29e4 + 4) {
    auVar17 = vdivps_avx(auVar27,*(undefined1 (*) [16])*local_29e0);
    *(undefined1 (*) [16])*local_29e0 = auVar17;
    local_29e0 = (undefined1 (*) [64])(*local_29e0 + 0x10);
  }
  for (; local_29e4 < in_ECX; local_29e4 = local_29e4 + 1) {
    *(float *)*local_29e0 = 1.0 / *(float *)*local_29e0;
    local_29e0 = (undefined1 (*) [64])(*local_29e0 + 4);
  }
  for (local_2ae4 = 0; local_2ae4 < in_ESI; local_2ae4 = local_2ae4 + 1) {
    local_2af0 = (undefined1 (*) [64])(in_RDI + (long)(local_2ae4 * in_EDX) * 4);
    local_2af8 = in_R9;
    for (local_2afc = 0; local_2afc + 0xf < in_ECX; local_2afc = local_2afc + 0x10) {
      auVar77 = vmulps_avx512f(*local_2af0,*local_2af8);
      *local_2af0 = auVar77;
      local_2af0 = local_2af0 + 1;
      local_2af8 = local_2af8 + 1;
    }
    for (; local_2afc + 7 < in_ECX; local_2afc = local_2afc + 8) {
      auVar69 = *(undefined1 (*) [12])*local_2af0;
      fStack_2b94 = (float)((ulong)*(undefined8 *)(*local_2af0 + 8) >> 0x20);
      fStack_2b90 = (float)*(undefined8 *)(*local_2af0 + 0x10);
      fStack_2b8c = (float)((ulong)*(undefined8 *)(*local_2af0 + 0x10) >> 0x20);
      fStack_2b88 = (float)*(undefined8 *)(*local_2af0 + 0x18);
      uStack_2b84 = (undefined4)((ulong)*(undefined8 *)(*local_2af0 + 0x18) >> 0x20);
      local_1560 = auVar69._0_4_;
      fStack_155c = auVar69._4_4_;
      fStack_1558 = auVar69._8_4_;
      local_1580 = (float)*(undefined8 *)*local_2af8;
      fStack_157c = (float)((ulong)*(undefined8 *)*local_2af8 >> 0x20);
      fStack_1578 = (float)*(undefined8 *)(*local_2af8 + 8);
      fStack_1574 = (float)((ulong)*(undefined8 *)(*local_2af8 + 8) >> 0x20);
      fStack_1570 = (float)*(undefined8 *)(*local_2af8 + 0x10);
      fStack_156c = (float)((ulong)*(undefined8 *)(*local_2af8 + 0x10) >> 0x20);
      fStack_1568 = (float)*(undefined8 *)(*local_2af8 + 0x18);
      auVar28._4_4_ = fStack_155c * fStack_157c;
      auVar28._0_4_ = local_1560 * local_1580;
      auVar28._12_4_ = fStack_2b94 * fStack_1574;
      auVar28._8_4_ = fStack_1558 * fStack_1578;
      auVar28._20_4_ = fStack_2b8c * fStack_156c;
      auVar28._16_4_ = fStack_2b90 * fStack_1570;
      auVar28._28_4_ = uStack_2b84;
      auVar28._24_4_ = fStack_2b88 * fStack_1568;
      *(undefined1 (*) [32])*local_2af0 = auVar28;
      local_2af0 = (undefined1 (*) [64])(*local_2af0 + 0x20);
      local_2af8 = (undefined1 (*) [64])(*local_2af8 + 0x20);
    }
    for (; local_2afc + 3 < in_ECX; local_2afc = local_2afc + 4) {
      auVar69 = *(undefined1 (*) [12])*local_2af0;
      fStack_2bc4 = (float)((ulong)*(undefined8 *)(*local_2af0 + 8) >> 0x20);
      local_14d0 = auVar69._0_4_;
      fStack_14cc = auVar69._4_4_;
      fStack_14c8 = auVar69._8_4_;
      local_14e0 = (float)*(undefined8 *)*local_2af8;
      fStack_14dc = (float)((ulong)*(undefined8 *)*local_2af8 >> 0x20);
      fStack_14d8 = (float)*(undefined8 *)(*local_2af8 + 8);
      fStack_14d4 = (float)((ulong)*(undefined8 *)(*local_2af8 + 8) >> 0x20);
      auVar29._4_4_ = fStack_14cc * fStack_14dc;
      auVar29._0_4_ = local_14d0 * local_14e0;
      auVar29._12_4_ = fStack_2bc4 * fStack_14d4;
      auVar29._8_4_ = fStack_14c8 * fStack_14d8;
      *(undefined1 (*) [16])*local_2af0 = auVar29;
      local_2af0 = (undefined1 (*) [64])(*local_2af0 + 0x10);
      local_2af8 = (undefined1 (*) [64])(*local_2af8 + 0x10);
    }
    for (; local_2afc < in_ECX; local_2afc = local_2afc + 1) {
      *(float *)*local_2af0 = *(float *)*local_2af8 * *(float *)*local_2af0;
      local_2af0 = (undefined1 (*) [64])(*local_2af0 + 4);
      local_2af8 = (undefined1 (*) [64])(*local_2af8 + 4);
    }
  }
  return;
}

Assistant:

static void softmax_pack1(float* _ptr, int elemcount, int stride, int size1, float* _maxptr, float* _sumptr)
{
    // reduce max
    for (int i = 0; i < elemcount; i++)
    {
        const float* ptr = _ptr + i * stride;
        float* maxptr = _maxptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; j + 15 < size1; j += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _max = _mm512_loadu_ps(maxptr);
            _max = _mm512_max_ps(_max, _p);
            _mm512_storeu_ps(maxptr, _max);
            ptr += 16;
            maxptr += 16;
        }
#endif // __AVX512F__
        for (; j + 7 < size1; j += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _max = _mm256_loadu_ps(maxptr);
            _max = _mm256_max_ps(_max, _p);
            _mm256_storeu_ps(maxptr, _max);
            ptr += 8;
            maxptr += 8;
        }
#endif // __AVX__
        for (; j + 3 < size1; j += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _max = _mm_loadu_ps(maxptr);
            _max = _mm_max_ps(_max, _p);
            _mm_storeu_ps(maxptr, _max);
            ptr += 4;
            maxptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *maxptr = std::max(*maxptr, *ptr);
            ptr++;
            maxptr++;
        }
    }

    // reduce exp(x - max)
    for (int i = 0; i < elemcount; i++)
    {
        float* ptr = _ptr + i * stride;
        const float* maxptr = _maxptr;
        float* sumptr = _sumptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; j + 15 < size1; j += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _max = _mm512_loadu_ps(maxptr);
            __m512 _sum = _mm512_loadu_ps(sumptr);
            _p = _mm512_sub_ps(_p, _max);
            _p = exp512_ps(_p);
            _mm512_storeu_ps(ptr, _p);
            _sum = _mm512_add_ps(_sum, _p);
            _mm512_storeu_ps(sumptr, _sum);
            ptr += 16;
            maxptr += 16;
            sumptr += 16;
        }
#endif // __AVX512F__
        for (; j + 7 < size1; j += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _max = _mm256_loadu_ps(maxptr);
            __m256 _sum = _mm256_loadu_ps(sumptr);
            _p = _mm256_sub_ps(_p, _max);
            _p = exp256_ps(_p);
            _mm256_storeu_ps(ptr, _p);
            _sum = _mm256_add_ps(_sum, _p);
            _mm256_storeu_ps(sumptr, _sum);
            ptr += 8;
            maxptr += 8;
            sumptr += 8;
        }
#endif // __AVX__
        for (; j + 3 < size1; j += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _max = _mm_loadu_ps(maxptr);
            __m128 _sum = _mm_loadu_ps(sumptr);
            _p = _mm_sub_ps(_p, _max);
            _p = exp_ps(_p);
            _mm_storeu_ps(ptr, _p);
            _sum = _mm_add_ps(_sum, _p);
            _mm_storeu_ps(sumptr, _sum);
            ptr += 4;
            maxptr += 4;
            sumptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            float v = expf(*ptr - *maxptr);
            *ptr = v;
            *sumptr += v;
            ptr++;
            maxptr++;
            sumptr++;
        }
    }

    {
        float* sumptr = _sumptr;
        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; j + 15 < size1; j += 16)
        {
            __m512 _sum = _mm512_loadu_ps(sumptr);
            _sum = _mm512_div_ps(_one_avx512, _sum);
            _mm512_storeu_ps(sumptr, _sum);
            sumptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; j + 7 < size1; j += 8)
        {
            __m256 _sum = _mm256_loadu_ps(sumptr);
            _sum = _mm256_div_ps(_one_avx, _sum);
            _mm256_storeu_ps(sumptr, _sum);
            sumptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        for (; j + 3 < size1; j += 4)
        {
            __m128 _sum = _mm_loadu_ps(sumptr);
            _sum = _mm_div_ps(_one, _sum);
            _mm_storeu_ps(sumptr, _sum);
            sumptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *sumptr = 1.f / *sumptr;
            sumptr++;
        }
    }

    // div sum
    for (int i = 0; i < elemcount; i++)
    {
        float* ptr = _ptr + i * stride;
        const float* sumptr = _sumptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; j + 15 < size1; j += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _sum = _mm512_loadu_ps(sumptr);
            _p = _mm512_mul_ps(_p, _sum);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
            sumptr += 16;
        }
#endif // __AVX512F__
        for (; j + 7 < size1; j += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _sum = _mm256_loadu_ps(sumptr);
            _p = _mm256_mul_ps(_p, _sum);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
            sumptr += 8;
        }
#endif // __AVX__
        for (; j + 3 < size1; j += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _sum = _mm_loadu_ps(sumptr);
            _p = _mm_mul_ps(_p, _sum);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
            sumptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *ptr *= *sumptr;
            ptr++;
            sumptr++;
        }
    }
}